

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_eval.h
# Opt level: O3

bool __thiscall
embree::sse2::PatchEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::eval
          (PatchEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *this,Ref This,float *u,
          float *v,float dscale,size_t depth)

{
  ulong uVar1;
  undefined8 *puVar2;
  uint uVar3;
  vfloat_impl<4> *pvVar4;
  vfloat_impl<4> *pvVar5;
  vfloat_impl<4> *pvVar6;
  vfloat_impl<4> *pvVar7;
  vfloat_impl<4> *pvVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  undefined8 uVar40;
  undefined1 auVar41 [16];
  size_t i_1;
  long lVar42;
  float *pfVar43;
  vfloat_impl<4> *pvVar44;
  long lVar45;
  DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *pDVar46;
  DynamicStackArray<float,_16UL,_64UL> *pDVar47;
  Ref This_00;
  size_t i;
  size_t *psVar48;
  ulong uVar49;
  ulong uVar50;
  long lVar51;
  bool bVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar65;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float t1_2;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar74;
  float fVar75;
  undefined1 auVar73 [16];
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar82;
  float fVar83;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar84;
  float fVar85;
  float fVar86;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float t1_4;
  float fVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar94;
  float fVar95;
  float fVar96;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar103;
  undefined1 auVar102 [16];
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float t1_1;
  float fVar109;
  float fVar110;
  float t1;
  float fVar111;
  float fVar112;
  float fVar113;
  CatmullClarkPatch patch;
  undefined8 local_e70;
  undefined8 uStack_e68;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_e38;
  DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *local_e30;
  DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *local_e20;
  undefined8 uStack_e18;
  size_t local_e10;
  PatchEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *local_e00;
  float *local_df0;
  undefined8 uStack_de8;
  float *local_de0;
  FeatureAdaptiveEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> local_db0;
  CatmullClarkPatch local_d80;
  
  if (This.ptr == 0) {
    return false;
  }
  bVar52 = false;
  switch((uint)This.ptr & 0xf) {
  case 1:
    pfVar43 = (float *)(This.ptr & 0xfffffffffffffff0);
    fVar86 = *u;
    fVar84 = *v;
    pvVar44 = this->P;
    pvVar4 = this->dPdu;
    pvVar5 = this->dPdv;
    pvVar6 = this->ddPdudu;
    pvVar7 = this->ddPdvdv;
    pvVar8 = this->ddPdudv;
    if (pvVar44 != (vfloat_impl<4> *)0x0) {
      fVar76 = pfVar43[9];
      fVar94 = pfVar43[10];
      fVar65 = pfVar43[0xb];
      fVar59 = pfVar43[0xd];
      fVar68 = pfVar43[0xe];
      fVar69 = pfVar43[0xf];
      fVar70 = (pfVar43[4] - *pfVar43) * fVar86 + *pfVar43;
      fVar67 = (pfVar43[5] - pfVar43[1]) * fVar86 + pfVar43[1];
      fVar72 = (pfVar43[6] - pfVar43[2]) * fVar86 + pfVar43[2];
      fVar74 = (pfVar43[7] - pfVar43[3]) * fVar86 + pfVar43[3];
      (pvVar44->field_0).v[0] =
           (((pfVar43[8] - pfVar43[0xc]) * fVar86 + pfVar43[0xc]) - fVar70) * fVar84 + fVar70;
      (pvVar44->field_0).v[1] = (((fVar76 - fVar59) * fVar86 + fVar59) - fVar67) * fVar84 + fVar67;
      (pvVar44->field_0).v[2] = (((fVar94 - fVar68) * fVar86 + fVar68) - fVar72) * fVar84 + fVar72;
      (pvVar44->field_0).v[3] = (((fVar65 - fVar69) * fVar86 + fVar69) - fVar74) * fVar84 + fVar74;
    }
    if (pvVar4 != (vfloat_impl<4> *)0x0) {
      fVar76 = pfVar43[5];
      fVar94 = pfVar43[6];
      fVar65 = pfVar43[7];
      fVar59 = pfVar43[9];
      fVar68 = pfVar43[10];
      fVar69 = pfVar43[0xb];
      fVar70 = pfVar43[1];
      fVar67 = pfVar43[2];
      fVar72 = pfVar43[3];
      fVar74 = pfVar43[0xd];
      fVar75 = pfVar43[0xe];
      fVar71 = pfVar43[0xf];
      (pvVar4->field_0).v[0] =
           (((pfVar43[8] - pfVar43[0xc]) - (pfVar43[4] - *pfVar43)) * fVar84 +
           (pfVar43[4] - *pfVar43)) * dscale;
      (pvVar4->field_0).v[1] =
           (((fVar59 - fVar74) - (fVar76 - fVar70)) * fVar84 + (fVar76 - fVar70)) * dscale;
      (pvVar4->field_0).v[2] =
           (((fVar68 - fVar75) - (fVar94 - fVar67)) * fVar84 + (fVar94 - fVar67)) * dscale;
      (pvVar4->field_0).v[3] =
           (((fVar69 - fVar71) - (fVar65 - fVar72)) * fVar84 + (fVar65 - fVar72)) * dscale;
      fVar84 = pfVar43[9];
      fVar76 = pfVar43[10];
      fVar94 = pfVar43[0xb];
      fVar65 = pfVar43[0xd];
      fVar59 = pfVar43[0xe];
      fVar68 = pfVar43[0xf];
      fVar69 = pfVar43[1];
      fVar70 = pfVar43[2];
      fVar67 = pfVar43[3];
      fVar72 = pfVar43[5];
      fVar74 = pfVar43[6];
      fVar75 = pfVar43[7];
      (pvVar5->field_0).v[0] =
           (((pfVar43[8] - pfVar43[4]) - (pfVar43[0xc] - *pfVar43)) * fVar86 +
           (pfVar43[0xc] - *pfVar43)) * dscale;
      (pvVar5->field_0).v[1] =
           (((fVar84 - fVar72) - (fVar65 - fVar69)) * fVar86 + (fVar65 - fVar69)) * dscale;
      (pvVar5->field_0).v[2] =
           (((fVar76 - fVar74) - (fVar59 - fVar70)) * fVar86 + (fVar59 - fVar70)) * dscale;
      (pvVar5->field_0).v[3] =
           (((fVar94 - fVar75) - (fVar68 - fVar67)) * fVar86 + (fVar68 - fVar67)) * dscale;
    }
    bVar52 = true;
    if (pvVar6 != (vfloat_impl<4> *)0x0) {
      fVar75 = dscale * dscale;
      fVar86 = fVar75 * 0.0;
      (pvVar6->field_0).v[0] = fVar86;
      (pvVar6->field_0).v[1] = fVar86;
      (pvVar6->field_0).v[2] = fVar86;
      (pvVar6->field_0).v[3] = fVar86;
      (pvVar7->field_0).v[0] = fVar86;
      (pvVar7->field_0).v[1] = fVar86;
      (pvVar7->field_0).v[2] = fVar86;
      (pvVar7->field_0).v[3] = fVar86;
      fVar86 = pfVar43[5];
      fVar84 = pfVar43[6];
      fVar76 = pfVar43[7];
      fVar94 = pfVar43[9];
      fVar65 = pfVar43[10];
      fVar59 = pfVar43[0xb];
      fVar68 = pfVar43[0xd];
      fVar69 = pfVar43[0xe];
      fVar70 = pfVar43[0xf];
      fVar67 = pfVar43[1];
      fVar72 = pfVar43[2];
      fVar74 = pfVar43[3];
      (pvVar8->field_0).v[0] = ((pfVar43[8] - pfVar43[0xc]) - (pfVar43[4] - *pfVar43)) * fVar75;
      (pvVar8->field_0).v[1] = ((fVar94 - fVar68) - (fVar86 - fVar67)) * fVar75;
      (pvVar8->field_0).v[2] = ((fVar65 - fVar69) - (fVar84 - fVar72)) * fVar75;
      (pvVar8->field_0).v[3] = ((fVar59 - fVar70) - (fVar76 - fVar74)) * fVar75;
    }
    break;
  case 2:
    BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::eval
              ((BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *)
               (This.ptr & 0xfffffffffffffff0),*u,*v,this->P,this->dPdu,this->dPdv,this->ddPdudu,
               this->ddPdvdv,this->ddPdudv,dscale);
    goto LAB_00d41419;
  case 3:
    pfVar43 = (float *)(This.ptr & 0xfffffffffffffff0);
    fVar86 = *u;
    fVar84 = *v;
    pvVar44 = this->P;
    pvVar4 = this->dPdu;
    pvVar5 = this->dPdv;
    pvVar6 = this->ddPdudu;
    pvVar7 = this->ddPdvdv;
    pvVar8 = this->ddPdudv;
    if (pvVar44 != (vfloat_impl<4> *)0x0) {
      fVar76 = 1.0 - fVar86;
      fVar109 = fVar86 * fVar86 * fVar86;
      fVar58 = fVar86 * fVar86 * 3.0 * fVar76;
      fVar57 = fVar76 * fVar76 * fVar76;
      fVar91 = fVar86 * 3.0 * fVar76 * fVar76;
      fVar76 = 1.0 - fVar84;
      fVar53 = fVar84 * fVar84 * 3.0 * fVar76;
      fVar56 = fVar76 * fVar76 * fVar76;
      fVar60 = fVar84 * 3.0 * fVar76 * fVar76;
      fVar55 = fVar84 * fVar84 * fVar84;
      fVar76 = pfVar43[0xd];
      fVar94 = pfVar43[0xe];
      fVar65 = pfVar43[0xf];
      fVar59 = pfVar43[9];
      fVar68 = pfVar43[10];
      fVar69 = pfVar43[0xb];
      fVar70 = pfVar43[5];
      fVar67 = pfVar43[6];
      fVar72 = pfVar43[7];
      fVar74 = pfVar43[1];
      fVar75 = pfVar43[2];
      fVar71 = pfVar43[3];
      fVar78 = pfVar43[0x1d];
      fVar82 = pfVar43[0x1e];
      fVar83 = pfVar43[0x1f];
      fVar77 = pfVar43[0x19];
      fVar85 = pfVar43[0x1a];
      fVar100 = pfVar43[0x1b];
      fVar103 = pfVar43[0x15];
      fVar13 = pfVar43[0x16];
      fVar14 = pfVar43[0x17];
      fVar15 = pfVar43[0x11];
      fVar16 = pfVar43[0x12];
      fVar17 = pfVar43[0x13];
      fVar18 = pfVar43[0x2d];
      fVar19 = pfVar43[0x2e];
      fVar20 = pfVar43[0x2f];
      fVar21 = pfVar43[0x29];
      fVar22 = pfVar43[0x2a];
      fVar23 = pfVar43[0x2b];
      fVar24 = pfVar43[0x25];
      fVar25 = pfVar43[0x26];
      fVar26 = pfVar43[0x27];
      fVar27 = pfVar43[0x21];
      fVar28 = pfVar43[0x22];
      fVar29 = pfVar43[0x23];
      fVar30 = pfVar43[0x3d];
      fVar31 = pfVar43[0x3e];
      fVar32 = pfVar43[0x3f];
      fVar33 = pfVar43[0x39];
      fVar34 = pfVar43[0x3a];
      fVar35 = pfVar43[0x3b];
      fVar36 = pfVar43[0x35];
      fVar37 = pfVar43[0x36];
      fVar38 = pfVar43[0x37];
      fVar39 = pfVar43[0x31];
      fVar66 = pfVar43[0x32];
      fVar54 = pfVar43[0x33];
      (pvVar44->field_0).v[0] =
           fVar55 * (fVar57 * pfVar43[0x30] +
                    fVar91 * pfVar43[0x34] + fVar58 * pfVar43[0x38] + fVar109 * pfVar43[0x3c]) +
           fVar53 * (pfVar43[0x20] * fVar57 +
                    pfVar43[0x24] * fVar91 + pfVar43[0x28] * fVar58 + pfVar43[0x2c] * fVar109) +
           fVar60 * (pfVar43[0x10] * fVar57 +
                    pfVar43[0x14] * fVar91 + pfVar43[0x18] * fVar58 + pfVar43[0x1c] * fVar109) +
           fVar56 * (*pfVar43 * fVar57 +
                    pfVar43[4] * fVar91 + pfVar43[8] * fVar58 + pfVar43[0xc] * fVar109);
      (pvVar44->field_0).v[1] =
           fVar55 * (fVar57 * fVar39 + fVar91 * fVar36 + fVar58 * fVar33 + fVar109 * fVar30) +
           fVar53 * (fVar27 * fVar57 + fVar24 * fVar91 + fVar21 * fVar58 + fVar18 * fVar109) +
           fVar60 * (fVar15 * fVar57 + fVar103 * fVar91 + fVar77 * fVar58 + fVar78 * fVar109) +
           fVar56 * (fVar74 * fVar57 + fVar70 * fVar91 + fVar59 * fVar58 + fVar76 * fVar109);
      (pvVar44->field_0).v[2] =
           fVar55 * (fVar57 * fVar66 + fVar91 * fVar37 + fVar58 * fVar34 + fVar109 * fVar31) +
           fVar53 * (fVar28 * fVar57 + fVar25 * fVar91 + fVar22 * fVar58 + fVar19 * fVar109) +
           fVar60 * (fVar16 * fVar57 + fVar13 * fVar91 + fVar85 * fVar58 + fVar82 * fVar109) +
           fVar56 * (fVar75 * fVar57 + fVar67 * fVar91 + fVar68 * fVar58 + fVar94 * fVar109);
      (pvVar44->field_0).v[3] =
           fVar55 * (fVar57 * fVar54 + fVar91 * fVar38 + fVar58 * fVar35 + fVar109 * fVar32) +
           fVar53 * (fVar29 * fVar57 + fVar26 * fVar91 + fVar23 * fVar58 + fVar20 * fVar109) +
           fVar60 * (fVar17 * fVar57 + fVar14 * fVar91 + fVar100 * fVar58 + fVar83 * fVar109) +
           fVar56 * (fVar71 * fVar57 + fVar72 * fVar91 + fVar69 * fVar58 + fVar65 * fVar109);
    }
    if (pvVar4 != (vfloat_impl<4> *)0x0) {
      fVar53 = 1.0 - fVar86;
      fVar96 = fVar86 * fVar86;
      fVar56 = fVar96 * 3.0;
      fVar60 = fVar56 * fVar53;
      fVar76 = fVar53 * fVar53;
      fVar94 = fVar86 * fVar53 + fVar86 * fVar53;
      fVar53 = fVar53 * fVar76;
      fVar104 = fVar86 * 3.0 * fVar76;
      fVar107 = fVar76 * -3.0;
      fVar55 = (fVar76 - fVar94) * 3.0;
      fVar99 = (fVar94 - fVar96) * 3.0;
      fVar95 = 1.0 - fVar84;
      fVar91 = fVar95 * fVar95;
      fVar76 = pfVar43[0xd];
      fVar94 = pfVar43[0xe];
      fVar65 = pfVar43[0xf];
      fVar59 = pfVar43[9];
      fVar68 = pfVar43[10];
      fVar69 = pfVar43[0xb];
      fVar70 = pfVar43[5];
      fVar67 = pfVar43[6];
      fVar72 = pfVar43[7];
      fVar74 = pfVar43[1];
      fVar75 = pfVar43[2];
      fVar71 = pfVar43[3];
      fVar78 = pfVar43[0x1d];
      fVar82 = pfVar43[0x1e];
      fVar83 = pfVar43[0x1f];
      fVar77 = pfVar43[0x19];
      fVar85 = pfVar43[0x1a];
      fVar100 = pfVar43[0x1b];
      fVar103 = pfVar43[0x15];
      fVar13 = pfVar43[0x16];
      fVar14 = pfVar43[0x17];
      fVar15 = pfVar43[0x11];
      fVar16 = pfVar43[0x12];
      fVar17 = pfVar43[0x13];
      fVar18 = pfVar43[0x2d];
      fVar19 = pfVar43[0x2e];
      fVar20 = pfVar43[0x2f];
      fVar21 = pfVar43[0x29];
      fVar22 = pfVar43[0x2a];
      fVar23 = pfVar43[0x2b];
      fVar24 = pfVar43[0x25];
      fVar25 = pfVar43[0x26];
      fVar26 = pfVar43[0x27];
      fVar27 = pfVar43[0x21];
      fVar28 = pfVar43[0x22];
      fVar29 = pfVar43[0x23];
      fVar30 = pfVar43[0x3d];
      fVar31 = pfVar43[0x3e];
      fVar32 = pfVar43[0x3f];
      fVar33 = pfVar43[0x39];
      fVar34 = pfVar43[0x3a];
      fVar35 = pfVar43[0x3b];
      fVar111 = fVar95 * fVar91;
      fVar106 = fVar84 * 3.0 * fVar91;
      fVar36 = pfVar43[0x35];
      fVar37 = pfVar43[0x36];
      fVar38 = pfVar43[0x37];
      fVar57 = fVar84 * fVar84;
      fVar39 = pfVar43[0x31];
      fVar66 = pfVar43[0x32];
      fVar54 = pfVar43[0x33];
      fVar101 = fVar84 * fVar57;
      fVar58 = fVar95 * fVar84 + fVar95 * fVar84;
      fVar109 = fVar57 * 3.0;
      fVar95 = fVar95 * fVar109;
      (pvVar4->field_0).v[0] =
           (fVar101 * (fVar107 * pfVar43[0x30] +
                      fVar55 * pfVar43[0x34] + fVar99 * pfVar43[0x38] + fVar56 * pfVar43[0x3c]) +
            fVar95 * (pfVar43[0x20] * fVar107 +
                     pfVar43[0x24] * fVar55 + pfVar43[0x28] * fVar99 + pfVar43[0x2c] * fVar56) +
            fVar106 * (pfVar43[0x10] * fVar107 +
                      pfVar43[0x14] * fVar55 + pfVar43[0x18] * fVar99 + pfVar43[0x1c] * fVar56) +
           fVar111 * (*pfVar43 * fVar107 +
                     pfVar43[4] * fVar55 + pfVar43[8] * fVar99 + pfVar43[0xc] * fVar56)) * dscale;
      (pvVar4->field_0).v[1] =
           (fVar101 * (fVar107 * fVar39 + fVar55 * fVar36 + fVar99 * fVar33 + fVar56 * fVar30) +
            fVar95 * (fVar27 * fVar107 + fVar24 * fVar55 + fVar21 * fVar99 + fVar18 * fVar56) +
            fVar106 * (fVar15 * fVar107 + fVar103 * fVar55 + fVar77 * fVar99 + fVar78 * fVar56) +
           fVar111 * (fVar74 * fVar107 + fVar70 * fVar55 + fVar59 * fVar99 + fVar76 * fVar56)) *
           dscale;
      (pvVar4->field_0).v[2] =
           (fVar101 * (fVar107 * fVar66 + fVar55 * fVar37 + fVar99 * fVar34 + fVar56 * fVar31) +
            fVar95 * (fVar28 * fVar107 + fVar25 * fVar55 + fVar22 * fVar99 + fVar19 * fVar56) +
            fVar106 * (fVar16 * fVar107 + fVar13 * fVar55 + fVar85 * fVar99 + fVar82 * fVar56) +
           fVar111 * (fVar75 * fVar107 + fVar67 * fVar55 + fVar68 * fVar99 + fVar94 * fVar56)) *
           dscale;
      (pvVar4->field_0).v[3] =
           (fVar101 * (fVar107 * fVar54 + fVar55 * fVar38 + fVar99 * fVar35 + fVar56 * fVar32) +
            fVar95 * (fVar29 * fVar107 + fVar26 * fVar55 + fVar23 * fVar99 + fVar20 * fVar56) +
            fVar106 * (fVar17 * fVar107 + fVar14 * fVar55 + fVar100 * fVar99 + fVar83 * fVar56) +
           fVar111 * (fVar71 * fVar107 + fVar72 * fVar55 + fVar69 * fVar99 + fVar65 * fVar56)) *
           dscale;
      fVar96 = fVar96 * fVar86;
      fVar56 = fVar91 * -3.0;
      fVar55 = (fVar91 - fVar58) * 3.0;
      fVar57 = (fVar58 - fVar57) * 3.0;
      fVar76 = pfVar43[0xd];
      fVar94 = pfVar43[0xe];
      fVar65 = pfVar43[0xf];
      fVar59 = pfVar43[9];
      fVar68 = pfVar43[10];
      fVar69 = pfVar43[0xb];
      fVar70 = pfVar43[5];
      fVar67 = pfVar43[6];
      fVar72 = pfVar43[7];
      fVar74 = pfVar43[1];
      fVar75 = pfVar43[2];
      fVar71 = pfVar43[3];
      fVar78 = pfVar43[0x1d];
      fVar82 = pfVar43[0x1e];
      fVar83 = pfVar43[0x1f];
      fVar77 = pfVar43[0x19];
      fVar85 = pfVar43[0x1a];
      fVar100 = pfVar43[0x1b];
      fVar103 = pfVar43[0x15];
      fVar13 = pfVar43[0x16];
      fVar14 = pfVar43[0x17];
      fVar15 = pfVar43[0x11];
      fVar16 = pfVar43[0x12];
      fVar17 = pfVar43[0x13];
      fVar18 = pfVar43[0x2d];
      fVar19 = pfVar43[0x2e];
      fVar20 = pfVar43[0x2f];
      fVar21 = pfVar43[0x29];
      fVar22 = pfVar43[0x2a];
      fVar23 = pfVar43[0x2b];
      fVar24 = pfVar43[0x25];
      fVar25 = pfVar43[0x26];
      fVar26 = pfVar43[0x27];
      fVar27 = pfVar43[0x21];
      fVar28 = pfVar43[0x22];
      fVar29 = pfVar43[0x23];
      fVar30 = pfVar43[0x3d];
      fVar31 = pfVar43[0x3e];
      fVar32 = pfVar43[0x3f];
      fVar33 = pfVar43[0x39];
      fVar34 = pfVar43[0x3a];
      fVar35 = pfVar43[0x3b];
      fVar36 = pfVar43[0x35];
      fVar37 = pfVar43[0x36];
      fVar38 = pfVar43[0x37];
      fVar39 = pfVar43[0x31];
      fVar66 = pfVar43[0x32];
      fVar54 = pfVar43[0x33];
      (pvVar5->field_0).v[0] =
           (fVar109 * (fVar53 * pfVar43[0x30] +
                      fVar104 * pfVar43[0x34] + fVar60 * pfVar43[0x38] + fVar96 * pfVar43[0x3c]) +
            fVar57 * (pfVar43[0x20] * fVar53 +
                     pfVar43[0x24] * fVar104 + pfVar43[0x28] * fVar60 + pfVar43[0x2c] * fVar96) +
            fVar55 * (pfVar43[0x10] * fVar53 +
                     pfVar43[0x14] * fVar104 + pfVar43[0x18] * fVar60 + pfVar43[0x1c] * fVar96) +
           fVar56 * (*pfVar43 * fVar53 +
                    pfVar43[4] * fVar104 + pfVar43[8] * fVar60 + pfVar43[0xc] * fVar96)) * dscale;
      (pvVar5->field_0).v[1] =
           (fVar109 * (fVar53 * fVar39 + fVar104 * fVar36 + fVar60 * fVar33 + fVar96 * fVar30) +
            fVar57 * (fVar27 * fVar53 + fVar24 * fVar104 + fVar21 * fVar60 + fVar18 * fVar96) +
            fVar55 * (fVar15 * fVar53 + fVar103 * fVar104 + fVar77 * fVar60 + fVar78 * fVar96) +
           fVar56 * (fVar74 * fVar53 + fVar70 * fVar104 + fVar59 * fVar60 + fVar76 * fVar96)) *
           dscale;
      (pvVar5->field_0).v[2] =
           (fVar109 * (fVar53 * fVar66 + fVar104 * fVar37 + fVar60 * fVar34 + fVar96 * fVar31) +
            fVar57 * (fVar28 * fVar53 + fVar25 * fVar104 + fVar22 * fVar60 + fVar19 * fVar96) +
            fVar55 * (fVar16 * fVar53 + fVar13 * fVar104 + fVar85 * fVar60 + fVar82 * fVar96) +
           fVar56 * (fVar75 * fVar53 + fVar67 * fVar104 + fVar68 * fVar60 + fVar94 * fVar96)) *
           dscale;
      (pvVar5->field_0).v[3] =
           (fVar109 * (fVar53 * fVar54 + fVar104 * fVar38 + fVar60 * fVar35 + fVar96 * fVar32) +
            fVar57 * (fVar29 * fVar53 + fVar26 * fVar104 + fVar23 * fVar60 + fVar20 * fVar96) +
            fVar55 * (fVar17 * fVar53 + fVar14 * fVar104 + fVar100 * fVar60 + fVar83 * fVar96) +
           fVar56 * (fVar71 * fVar53 + fVar72 * fVar104 + fVar69 * fVar60 + fVar65 * fVar96)) *
           dscale;
    }
    bVar52 = true;
    if (pvVar6 != (vfloat_impl<4> *)0x0) {
      fVar109 = 1.0 - fVar86;
      fVar91 = fVar109 * 6.0;
      fVar53 = (fVar86 - (fVar109 + fVar109)) * 6.0;
      fVar60 = (fVar109 - (fVar86 + fVar86)) * 6.0;
      fVar104 = fVar86 * 6.0;
      fVar95 = 1.0 - fVar84;
      fVar55 = fVar95 * fVar95;
      fVar99 = fVar95 * fVar55;
      fVar76 = pfVar43[0xd];
      fVar94 = pfVar43[0xe];
      fVar65 = pfVar43[0xf];
      fVar59 = pfVar43[9];
      fVar68 = pfVar43[10];
      fVar69 = pfVar43[0xb];
      fVar70 = pfVar43[5];
      fVar67 = pfVar43[6];
      fVar72 = pfVar43[7];
      fVar74 = pfVar43[1];
      fVar75 = pfVar43[2];
      fVar71 = pfVar43[3];
      fVar78 = pfVar43[0x1d];
      fVar82 = pfVar43[0x1e];
      fVar83 = pfVar43[0x1f];
      fVar77 = pfVar43[0x19];
      fVar85 = pfVar43[0x1a];
      fVar100 = pfVar43[0x1b];
      fVar103 = pfVar43[0x15];
      fVar13 = pfVar43[0x16];
      fVar14 = pfVar43[0x17];
      fVar15 = pfVar43[0x11];
      fVar16 = pfVar43[0x12];
      fVar17 = pfVar43[0x13];
      fVar18 = pfVar43[0x2d];
      fVar19 = pfVar43[0x2e];
      fVar20 = pfVar43[0x2f];
      fVar21 = pfVar43[0x29];
      fVar22 = pfVar43[0x2a];
      fVar23 = pfVar43[0x2b];
      fVar24 = pfVar43[0x25];
      fVar25 = pfVar43[0x26];
      fVar26 = pfVar43[0x27];
      fVar27 = pfVar43[0x21];
      fVar28 = pfVar43[0x22];
      fVar29 = pfVar43[0x23];
      fVar30 = pfVar43[0x3d];
      fVar31 = pfVar43[0x3e];
      fVar32 = pfVar43[0x3f];
      fVar33 = pfVar43[0x39];
      fVar34 = pfVar43[0x3a];
      fVar35 = pfVar43[0x3b];
      fVar107 = fVar84 * 3.0 * fVar55;
      fVar36 = pfVar43[0x35];
      fVar37 = pfVar43[0x36];
      fVar38 = pfVar43[0x37];
      fVar106 = fVar84 * fVar84;
      fVar39 = pfVar43[0x31];
      fVar66 = pfVar43[0x32];
      fVar54 = pfVar43[0x33];
      fVar101 = fVar84 * fVar106;
      fVar58 = fVar95 * fVar84 + fVar95 * fVar84;
      fVar96 = fVar106 * 3.0;
      fVar57 = fVar95 * fVar96;
      fVar56 = dscale * dscale;
      (pvVar6->field_0).v[0] =
           (fVar101 * (fVar91 * pfVar43[0x30] +
                      fVar53 * pfVar43[0x34] + fVar60 * pfVar43[0x38] + fVar104 * pfVar43[0x3c]) +
            fVar57 * (pfVar43[0x20] * fVar91 +
                     pfVar43[0x24] * fVar53 + pfVar43[0x28] * fVar60 + pfVar43[0x2c] * fVar104) +
            fVar107 * (pfVar43[0x10] * fVar91 +
                      pfVar43[0x14] * fVar53 + pfVar43[0x18] * fVar60 + pfVar43[0x1c] * fVar104) +
           fVar99 * (*pfVar43 * fVar91 +
                    pfVar43[4] * fVar53 + pfVar43[8] * fVar60 + pfVar43[0xc] * fVar104)) * fVar56;
      (pvVar6->field_0).v[1] =
           (fVar101 * (fVar91 * fVar39 + fVar53 * fVar36 + fVar60 * fVar33 + fVar104 * fVar30) +
            fVar57 * (fVar27 * fVar91 + fVar24 * fVar53 + fVar21 * fVar60 + fVar18 * fVar104) +
            fVar107 * (fVar15 * fVar91 + fVar103 * fVar53 + fVar77 * fVar60 + fVar78 * fVar104) +
           fVar99 * (fVar74 * fVar91 + fVar70 * fVar53 + fVar59 * fVar60 + fVar76 * fVar104)) *
           fVar56;
      (pvVar6->field_0).v[2] =
           (fVar101 * (fVar91 * fVar66 + fVar53 * fVar37 + fVar60 * fVar34 + fVar104 * fVar31) +
            fVar57 * (fVar28 * fVar91 + fVar25 * fVar53 + fVar22 * fVar60 + fVar19 * fVar104) +
            fVar107 * (fVar16 * fVar91 + fVar13 * fVar53 + fVar85 * fVar60 + fVar82 * fVar104) +
           fVar99 * (fVar75 * fVar91 + fVar67 * fVar53 + fVar68 * fVar60 + fVar94 * fVar104)) *
           fVar56;
      (pvVar6->field_0).v[3] =
           (fVar101 * (fVar91 * fVar54 + fVar53 * fVar38 + fVar60 * fVar35 + fVar104 * fVar32) +
            fVar57 * (fVar29 * fVar91 + fVar26 * fVar53 + fVar23 * fVar60 + fVar20 * fVar104) +
            fVar107 * (fVar17 * fVar91 + fVar14 * fVar53 + fVar100 * fVar60 + fVar83 * fVar104) +
           fVar99 * (fVar71 * fVar91 + fVar72 * fVar53 + fVar69 * fVar60 + fVar65 * fVar104)) *
           fVar56;
      fVar99 = fVar109 * fVar109;
      fVar57 = fVar86 * fVar86;
      fVar54 = fVar95 * 6.0;
      fVar91 = (fVar84 - (fVar95 + fVar95)) * 6.0;
      fVar95 = (fVar95 - (fVar84 + fVar84)) * 6.0;
      fVar84 = fVar84 * 6.0;
      fVar101 = fVar86 * fVar57;
      fVar104 = fVar109 * fVar86 + fVar109 * fVar86;
      fVar60 = fVar57 * 3.0;
      fVar107 = fVar109 * fVar60;
      fVar76 = pfVar43[0xd];
      fVar94 = pfVar43[0xe];
      fVar65 = pfVar43[0xf];
      fVar59 = pfVar43[9];
      fVar68 = pfVar43[10];
      fVar69 = pfVar43[0xb];
      fVar53 = fVar86 * 3.0 * fVar99;
      fVar86 = pfVar43[5];
      fVar70 = pfVar43[6];
      fVar67 = pfVar43[7];
      fVar109 = fVar109 * fVar99;
      fVar72 = pfVar43[1];
      fVar74 = pfVar43[2];
      fVar75 = pfVar43[3];
      fVar71 = pfVar43[0x1d];
      fVar78 = pfVar43[0x1e];
      fVar82 = pfVar43[0x1f];
      fVar83 = pfVar43[0x19];
      fVar77 = pfVar43[0x1a];
      fVar85 = pfVar43[0x1b];
      fVar100 = pfVar43[0x15];
      fVar103 = pfVar43[0x16];
      fVar13 = pfVar43[0x17];
      fVar14 = pfVar43[0x11];
      fVar15 = pfVar43[0x12];
      fVar16 = pfVar43[0x13];
      fVar17 = pfVar43[0x2d];
      fVar18 = pfVar43[0x2e];
      fVar19 = pfVar43[0x2f];
      fVar20 = pfVar43[0x29];
      fVar21 = pfVar43[0x2a];
      fVar22 = pfVar43[0x2b];
      fVar23 = pfVar43[0x25];
      fVar24 = pfVar43[0x26];
      fVar25 = pfVar43[0x27];
      fVar26 = pfVar43[0x21];
      fVar27 = pfVar43[0x22];
      fVar28 = pfVar43[0x23];
      fVar29 = pfVar43[0x3d];
      fVar30 = pfVar43[0x3e];
      fVar31 = pfVar43[0x3f];
      fVar32 = pfVar43[0x39];
      fVar33 = pfVar43[0x3a];
      fVar34 = pfVar43[0x3b];
      fVar35 = pfVar43[0x35];
      fVar36 = pfVar43[0x36];
      fVar37 = pfVar43[0x37];
      fVar38 = pfVar43[0x31];
      fVar39 = pfVar43[0x32];
      fVar66 = pfVar43[0x33];
      (pvVar7->field_0).v[0] =
           (fVar84 * (fVar109 * pfVar43[0x30] +
                     fVar53 * pfVar43[0x34] + fVar107 * pfVar43[0x38] + fVar101 * pfVar43[0x3c]) +
            fVar95 * (pfVar43[0x20] * fVar109 +
                     pfVar43[0x24] * fVar53 + pfVar43[0x28] * fVar107 + pfVar43[0x2c] * fVar101) +
            fVar91 * (pfVar43[0x10] * fVar109 +
                     pfVar43[0x14] * fVar53 + pfVar43[0x18] * fVar107 + pfVar43[0x1c] * fVar101) +
           fVar54 * (*pfVar43 * fVar109 +
                    pfVar43[4] * fVar53 + pfVar43[8] * fVar107 + pfVar43[0xc] * fVar101)) * fVar56;
      (pvVar7->field_0).v[1] =
           (fVar84 * (fVar109 * fVar38 + fVar53 * fVar35 + fVar107 * fVar32 + fVar101 * fVar29) +
            fVar95 * (fVar26 * fVar109 + fVar23 * fVar53 + fVar20 * fVar107 + fVar17 * fVar101) +
            fVar91 * (fVar14 * fVar109 + fVar100 * fVar53 + fVar83 * fVar107 + fVar71 * fVar101) +
           fVar54 * (fVar72 * fVar109 + fVar86 * fVar53 + fVar59 * fVar107 + fVar76 * fVar101)) *
           fVar56;
      (pvVar7->field_0).v[2] =
           (fVar84 * (fVar109 * fVar39 + fVar53 * fVar36 + fVar107 * fVar33 + fVar101 * fVar30) +
            fVar95 * (fVar27 * fVar109 + fVar24 * fVar53 + fVar21 * fVar107 + fVar18 * fVar101) +
            fVar91 * (fVar15 * fVar109 + fVar103 * fVar53 + fVar77 * fVar107 + fVar78 * fVar101) +
           fVar54 * (fVar74 * fVar109 + fVar70 * fVar53 + fVar68 * fVar107 + fVar94 * fVar101)) *
           fVar56;
      (pvVar7->field_0).v[3] =
           (fVar84 * (fVar109 * fVar66 + fVar53 * fVar37 + fVar107 * fVar34 + fVar101 * fVar31) +
            fVar95 * (fVar28 * fVar109 + fVar25 * fVar53 + fVar22 * fVar107 + fVar19 * fVar101) +
            fVar91 * (fVar16 * fVar109 + fVar13 * fVar53 + fVar85 * fVar107 + fVar82 * fVar101) +
           fVar54 * (fVar75 * fVar109 + fVar67 * fVar53 + fVar69 * fVar107 + fVar65 * fVar101)) *
           fVar56;
      fVar109 = fVar99 * -3.0;
      fVar54 = (fVar99 - fVar104) * 3.0;
      fVar57 = (fVar104 - fVar57) * 3.0;
      fVar66 = fVar55 * -3.0;
      fVar55 = (fVar55 - fVar58) * 3.0;
      fVar53 = (fVar58 - fVar106) * 3.0;
      fVar86 = pfVar43[0xd];
      fVar84 = pfVar43[0xe];
      fVar76 = pfVar43[0xf];
      fVar94 = pfVar43[9];
      fVar65 = pfVar43[10];
      fVar59 = pfVar43[0xb];
      fVar68 = pfVar43[5];
      fVar69 = pfVar43[6];
      fVar70 = pfVar43[7];
      fVar67 = pfVar43[1];
      fVar72 = pfVar43[2];
      fVar74 = pfVar43[3];
      fVar75 = pfVar43[0x1d];
      fVar71 = pfVar43[0x1e];
      fVar78 = pfVar43[0x1f];
      fVar82 = pfVar43[0x19];
      fVar83 = pfVar43[0x1a];
      fVar77 = pfVar43[0x1b];
      fVar85 = pfVar43[0x15];
      fVar100 = pfVar43[0x16];
      fVar103 = pfVar43[0x17];
      fVar13 = pfVar43[0x11];
      fVar14 = pfVar43[0x12];
      fVar15 = pfVar43[0x13];
      fVar16 = pfVar43[0x2d];
      fVar17 = pfVar43[0x2e];
      fVar18 = pfVar43[0x2f];
      fVar19 = pfVar43[0x29];
      fVar20 = pfVar43[0x2a];
      fVar21 = pfVar43[0x2b];
      fVar22 = pfVar43[0x25];
      fVar23 = pfVar43[0x26];
      fVar24 = pfVar43[0x27];
      fVar25 = pfVar43[0x21];
      fVar26 = pfVar43[0x22];
      fVar27 = pfVar43[0x23];
      fVar28 = pfVar43[0x3d];
      fVar29 = pfVar43[0x3e];
      fVar30 = pfVar43[0x3f];
      fVar31 = pfVar43[0x39];
      fVar32 = pfVar43[0x3a];
      fVar33 = pfVar43[0x3b];
      fVar34 = pfVar43[0x35];
      fVar35 = pfVar43[0x36];
      fVar36 = pfVar43[0x37];
      fVar37 = pfVar43[0x31];
      fVar38 = pfVar43[0x32];
      fVar39 = pfVar43[0x33];
      (pvVar8->field_0).v[0] =
           (fVar96 * (fVar109 * pfVar43[0x30] +
                     fVar54 * pfVar43[0x34] + fVar57 * pfVar43[0x38] + fVar60 * pfVar43[0x3c]) +
            fVar53 * (pfVar43[0x20] * fVar109 +
                     pfVar43[0x24] * fVar54 + pfVar43[0x28] * fVar57 + pfVar43[0x2c] * fVar60) +
            fVar55 * (pfVar43[0x10] * fVar109 +
                     pfVar43[0x14] * fVar54 + pfVar43[0x18] * fVar57 + pfVar43[0x1c] * fVar60) +
           fVar66 * (*pfVar43 * fVar109 +
                    pfVar43[4] * fVar54 + pfVar43[8] * fVar57 + pfVar43[0xc] * fVar60)) * fVar56;
      (pvVar8->field_0).v[1] =
           (fVar96 * (fVar109 * fVar37 + fVar54 * fVar34 + fVar57 * fVar31 + fVar60 * fVar28) +
            fVar53 * (fVar25 * fVar109 + fVar22 * fVar54 + fVar19 * fVar57 + fVar16 * fVar60) +
            fVar55 * (fVar13 * fVar109 + fVar85 * fVar54 + fVar82 * fVar57 + fVar75 * fVar60) +
           fVar66 * (fVar67 * fVar109 + fVar68 * fVar54 + fVar94 * fVar57 + fVar86 * fVar60)) *
           fVar56;
      (pvVar8->field_0).v[2] =
           (fVar96 * (fVar109 * fVar38 + fVar54 * fVar35 + fVar57 * fVar32 + fVar60 * fVar29) +
            fVar53 * (fVar26 * fVar109 + fVar23 * fVar54 + fVar20 * fVar57 + fVar17 * fVar60) +
            fVar55 * (fVar14 * fVar109 + fVar100 * fVar54 + fVar83 * fVar57 + fVar71 * fVar60) +
           fVar66 * (fVar72 * fVar109 + fVar69 * fVar54 + fVar65 * fVar57 + fVar84 * fVar60)) *
           fVar56;
      (pvVar8->field_0).v[3] =
           (fVar96 * (fVar109 * fVar39 + fVar54 * fVar36 + fVar57 * fVar33 + fVar60 * fVar30) +
            fVar53 * (fVar27 * fVar109 + fVar24 * fVar54 + fVar21 * fVar57 + fVar18 * fVar60) +
            fVar55 * (fVar15 * fVar109 + fVar103 * fVar54 + fVar77 * fVar57 + fVar78 * fVar60) +
           fVar66 * (fVar74 * fVar109 + fVar70 * fVar54 + fVar59 * fVar57 + fVar76 * fVar60)) *
           fVar56;
    }
    break;
  case 4:
    pfVar43 = (float *)(This.ptr & 0xfffffffffffffff0);
    fVar86 = *u;
    fVar84 = *v;
    pvVar44 = this->P;
    pvVar4 = this->dPdu;
    pvVar5 = this->dPdv;
    pvVar6 = this->ddPdudu;
    pvVar7 = this->ddPdvdv;
    pvVar8 = this->ddPdudv;
    if (pvVar44 != (vfloat_impl<4> *)0x0) {
      if (((((fVar84 == 1.0) && (!NAN(fVar84))) || ((fVar86 == 0.0 && (!NAN(fVar86))))) ||
          ((fVar86 == 1.0 && (!NAN(fVar86))))) || ((fVar84 == 0.0 && (!NAN(fVar84))))) {
        fVar68 = pfVar43[0x14];
        fVar69 = pfVar43[0x15];
        fVar70 = pfVar43[0x16];
        fVar67 = pfVar43[0x17];
        fVar72 = pfVar43[0x18];
        fVar74 = pfVar43[0x19];
        fVar75 = pfVar43[0x1a];
        fVar71 = pfVar43[0x1b];
        fVar76 = pfVar43[0x24];
        fVar94 = pfVar43[0x25];
        fVar65 = pfVar43[0x26];
        fVar59 = pfVar43[0x27];
        fVar78 = pfVar43[0x28];
        fVar82 = pfVar43[0x29];
        fVar83 = pfVar43[0x2a];
        fVar77 = pfVar43[0x2b];
      }
      else {
        fVar76 = fVar86 + fVar84;
        auVar87 = rcpss(ZEXT416((uint)fVar76),ZEXT416((uint)fVar76));
        fVar67 = (2.0 - fVar76 * auVar87._0_4_) * auVar87._0_4_;
        fVar68 = fVar67 * (pfVar43[0x40] * fVar84 + pfVar43[0x14] * fVar86);
        fVar69 = fVar67 * (pfVar43[0x41] * fVar84 + pfVar43[0x15] * fVar86);
        fVar70 = fVar67 * (pfVar43[0x42] * fVar84 + pfVar43[0x16] * fVar86);
        fVar67 = fVar67 * (pfVar43[0x43] * fVar84 + pfVar43[0x17] * fVar86);
        fVar85 = 1.0 - fVar84;
        fVar76 = 1.0 - fVar86;
        auVar87._4_4_ = fVar76;
        auVar87._0_4_ = fVar76;
        auVar87._8_4_ = fVar76;
        auVar87._12_4_ = fVar76;
        auVar92._4_12_ = auVar87._4_12_;
        auVar92._0_4_ = fVar76 + fVar84;
        auVar97._4_4_ = fVar76;
        auVar97._0_4_ = auVar92._0_4_;
        auVar97._8_4_ = fVar76;
        auVar97._12_4_ = fVar76;
        auVar87 = rcpss(auVar97,auVar92);
        fVar71 = (2.0 - auVar92._0_4_ * auVar87._0_4_) * auVar87._0_4_;
        fVar72 = fVar71 * (fVar84 * pfVar43[0x18] + pfVar43[0x44] * fVar76);
        fVar74 = fVar71 * (fVar84 * pfVar43[0x19] + pfVar43[0x45] * fVar76);
        fVar75 = fVar71 * (fVar84 * pfVar43[0x1a] + pfVar43[0x46] * fVar76);
        fVar71 = fVar71 * (fVar84 * pfVar43[0x1b] + pfVar43[0x47] * fVar76);
        fVar94 = (2.0 - fVar86) - fVar84;
        auVar87 = rcpss(ZEXT416((uint)fVar94),ZEXT416((uint)fVar94));
        fVar77 = (2.0 - fVar94 * auVar87._0_4_) * auVar87._0_4_;
        fVar78 = fVar77 * (pfVar43[0x4c] * fVar85 + fVar76 * pfVar43[0x28]);
        fVar82 = fVar77 * (pfVar43[0x4d] * fVar85 + fVar76 * pfVar43[0x29]);
        fVar83 = fVar77 * (pfVar43[0x4e] * fVar85 + fVar76 * pfVar43[0x2a]);
        fVar77 = fVar77 * (pfVar43[0x4f] * fVar85 + fVar76 * pfVar43[0x2b]);
        fVar76 = (fVar86 + 1.0) - fVar84;
        auVar87 = rcpss(ZEXT416((uint)fVar76),ZEXT416((uint)fVar76));
        fVar59 = (2.0 - fVar76 * auVar87._0_4_) * auVar87._0_4_;
        fVar76 = fVar59 * (fVar85 * pfVar43[0x24] + fVar86 * pfVar43[0x48]);
        fVar94 = fVar59 * (fVar85 * pfVar43[0x25] + fVar86 * pfVar43[0x49]);
        fVar65 = fVar59 * (fVar85 * pfVar43[0x26] + fVar86 * pfVar43[0x4a]);
        fVar59 = fVar59 * (fVar85 * pfVar43[0x27] + fVar86 * pfVar43[0x4b]);
      }
      fVar85 = 1.0 - fVar86;
      fVar109 = 1.0 - fVar84;
      fVar104 = fVar86 * fVar86 * fVar86;
      fVar55 = fVar86 * fVar86 * 3.0 * fVar85;
      fVar91 = fVar85 * fVar85 * fVar85;
      fVar99 = fVar86 * 3.0 * fVar85 * fVar85;
      fVar106 = fVar84 * 3.0 * fVar109 * fVar109;
      fVar58 = fVar84 * fVar84 * 3.0 * fVar109;
      fVar95 = fVar84 * fVar84 * fVar84;
      fVar109 = fVar109 * fVar109 * fVar109;
      fVar85 = pfVar43[0xd];
      fVar100 = pfVar43[0xe];
      fVar103 = pfVar43[0xf];
      fVar13 = pfVar43[9];
      fVar14 = pfVar43[10];
      fVar15 = pfVar43[0xb];
      fVar16 = pfVar43[5];
      fVar17 = pfVar43[6];
      fVar18 = pfVar43[7];
      fVar19 = pfVar43[1];
      fVar20 = pfVar43[2];
      fVar21 = pfVar43[3];
      fVar22 = pfVar43[0x1d];
      fVar23 = pfVar43[0x1e];
      fVar24 = pfVar43[0x1f];
      fVar25 = pfVar43[0x11];
      fVar26 = pfVar43[0x12];
      fVar27 = pfVar43[0x13];
      fVar28 = pfVar43[0x2d];
      fVar29 = pfVar43[0x2e];
      fVar30 = pfVar43[0x2f];
      fVar31 = pfVar43[0x21];
      fVar32 = pfVar43[0x22];
      fVar33 = pfVar43[0x23];
      fVar34 = pfVar43[0x3d];
      fVar35 = pfVar43[0x3e];
      fVar36 = pfVar43[0x3f];
      fVar37 = pfVar43[0x39];
      fVar38 = pfVar43[0x3a];
      fVar39 = pfVar43[0x3b];
      fVar66 = pfVar43[0x35];
      fVar54 = pfVar43[0x36];
      fVar53 = pfVar43[0x37];
      fVar57 = pfVar43[0x31];
      fVar56 = pfVar43[0x32];
      fVar60 = pfVar43[0x33];
      (pvVar44->field_0).v[0] =
           fVar95 * (fVar91 * pfVar43[0x30] +
                    fVar99 * pfVar43[0x34] + fVar55 * pfVar43[0x38] + fVar104 * pfVar43[0x3c]) +
           (pfVar43[0x20] * fVar91 + fVar76 * fVar99 + fVar78 * fVar55 + pfVar43[0x2c] * fVar104) *
           fVar58 + (pfVar43[0x10] * fVar91 +
                    fVar68 * fVar99 + fVar72 * fVar55 + pfVar43[0x1c] * fVar104) * fVar106 +
           (*pfVar43 * fVar91 + pfVar43[4] * fVar99 + pfVar43[8] * fVar55 + pfVar43[0xc] * fVar104)
           * fVar109;
      (pvVar44->field_0).v[1] =
           fVar95 * (fVar91 * fVar57 + fVar99 * fVar66 + fVar55 * fVar37 + fVar104 * fVar34) +
           (fVar31 * fVar91 + fVar94 * fVar99 + fVar82 * fVar55 + fVar28 * fVar104) * fVar58 +
           (fVar25 * fVar91 + fVar69 * fVar99 + fVar74 * fVar55 + fVar22 * fVar104) * fVar106 +
           (fVar19 * fVar91 + fVar16 * fVar99 + fVar13 * fVar55 + fVar85 * fVar104) * fVar109;
      (pvVar44->field_0).v[2] =
           fVar95 * (fVar91 * fVar56 + fVar99 * fVar54 + fVar55 * fVar38 + fVar104 * fVar35) +
           (fVar32 * fVar91 + fVar65 * fVar99 + fVar83 * fVar55 + fVar29 * fVar104) * fVar58 +
           (fVar26 * fVar91 + fVar70 * fVar99 + fVar75 * fVar55 + fVar23 * fVar104) * fVar106 +
           (fVar20 * fVar91 + fVar17 * fVar99 + fVar14 * fVar55 + fVar100 * fVar104) * fVar109;
      (pvVar44->field_0).v[3] =
           fVar95 * (fVar91 * fVar60 + fVar99 * fVar53 + fVar55 * fVar39 + fVar104 * fVar36) +
           (fVar33 * fVar91 + fVar59 * fVar99 + fVar77 * fVar55 + fVar30 * fVar104) * fVar58 +
           (fVar27 * fVar91 + fVar67 * fVar99 + fVar71 * fVar55 + fVar24 * fVar104) * fVar106 +
           (fVar21 * fVar91 + fVar18 * fVar99 + fVar15 * fVar55 + fVar103 * fVar104) * fVar109;
    }
    if (pvVar4 != (vfloat_impl<4> *)0x0) {
      fVar76 = pfVar43[0x14];
      fVar94 = pfVar43[0x15];
      fVar65 = pfVar43[0x16];
      fVar59 = pfVar43[0x17];
      fVar68 = pfVar43[0x18];
      fVar69 = pfVar43[0x19];
      fVar70 = pfVar43[0x1a];
      fVar67 = pfVar43[0x1b];
      fVar72 = pfVar43[0x24];
      fVar74 = pfVar43[0x25];
      fVar75 = pfVar43[0x26];
      fVar71 = pfVar43[0x27];
      fVar78 = pfVar43[0x28];
      fVar82 = pfVar43[0x29];
      fVar83 = pfVar43[0x2a];
      fVar77 = pfVar43[0x2b];
      if ((fVar84 != 1.0 && fVar84 != 0.0) && (fVar86 != 0.0 && fVar86 != 1.0)) {
        fVar85 = fVar86 + fVar84;
        auVar87 = rcpss(ZEXT416((uint)fVar85),ZEXT416((uint)fVar85));
        fVar100 = 1.0 - fVar84;
        fVar103 = 1.0 - fVar86;
        fVar85 = (2.0 - fVar85 * auVar87._0_4_) * auVar87._0_4_;
        fVar76 = fVar85 * (pfVar43[0x40] * fVar84 + fVar76 * fVar86);
        fVar94 = fVar85 * (pfVar43[0x41] * fVar84 + fVar94 * fVar86);
        fVar65 = fVar85 * (pfVar43[0x42] * fVar84 + fVar65 * fVar86);
        fVar59 = fVar85 * (pfVar43[0x43] * fVar84 + fVar59 * fVar86);
        auVar61._4_4_ = fVar103;
        auVar61._0_4_ = fVar103;
        auVar61._8_4_ = fVar103;
        auVar61._12_4_ = fVar103;
        auVar62._4_12_ = auVar61._4_12_;
        auVar62._0_4_ = fVar103 + fVar84;
        auVar79._4_4_ = fVar103;
        auVar79._0_4_ = auVar62._0_4_;
        auVar79._8_4_ = fVar103;
        auVar79._12_4_ = fVar103;
        auVar87 = rcpss(auVar79,auVar62);
        fVar85 = (2.0 - auVar62._0_4_ * auVar87._0_4_) * auVar87._0_4_;
        fVar68 = fVar85 * (fVar84 * fVar68 + pfVar43[0x44] * fVar103);
        fVar69 = fVar85 * (fVar84 * fVar69 + pfVar43[0x45] * fVar103);
        fVar70 = fVar85 * (fVar84 * fVar70 + pfVar43[0x46] * fVar103);
        fVar67 = fVar85 * (fVar84 * fVar67 + pfVar43[0x47] * fVar103);
        fVar85 = (2.0 - fVar86) - fVar84;
        auVar87 = rcpss(ZEXT416((uint)fVar85),ZEXT416((uint)fVar85));
        fVar85 = (2.0 - fVar85 * auVar87._0_4_) * auVar87._0_4_;
        fVar78 = fVar85 * (pfVar43[0x4c] * fVar100 + fVar103 * fVar78);
        fVar82 = fVar85 * (pfVar43[0x4d] * fVar100 + fVar103 * fVar82);
        fVar83 = fVar85 * (pfVar43[0x4e] * fVar100 + fVar103 * fVar83);
        fVar77 = fVar85 * (pfVar43[0x4f] * fVar100 + fVar103 * fVar77);
        fVar85 = (fVar86 + 1.0) - fVar84;
        auVar87 = rcpss(ZEXT416((uint)fVar85),ZEXT416((uint)fVar85));
        fVar85 = (2.0 - fVar85 * auVar87._0_4_) * auVar87._0_4_;
        fVar72 = fVar85 * (fVar100 * fVar72 + fVar86 * pfVar43[0x48]);
        fVar74 = fVar85 * (fVar100 * fVar74 + fVar86 * pfVar43[0x49]);
        fVar75 = fVar85 * (fVar100 * fVar75 + fVar86 * pfVar43[0x4a]);
        fVar71 = fVar85 * (fVar100 * fVar71 + fVar86 * pfVar43[0x4b]);
      }
      auVar102._4_4_ = 1.0 - fVar86;
      fVar107 = 1.0 - fVar84;
      fVar55 = auVar102._4_4_ * auVar102._4_4_;
      fVar85 = fVar86 * auVar102._4_4_ + fVar86 * auVar102._4_4_;
      fVar91 = fVar86 * fVar86;
      fVar113 = fVar55 * -3.0;
      fVar112 = (fVar55 - fVar85) * 3.0;
      fVar111 = (fVar85 - fVar91) * 3.0;
      fVar95 = fVar91 * 3.0;
      fVar104 = fVar107 * fVar107;
      fVar85 = pfVar43[0xd];
      fVar100 = pfVar43[0xe];
      fVar103 = pfVar43[0xf];
      fVar13 = pfVar43[9];
      fVar14 = pfVar43[10];
      fVar15 = pfVar43[0xb];
      fVar16 = pfVar43[5];
      fVar17 = pfVar43[6];
      fVar18 = pfVar43[7];
      fVar19 = pfVar43[1];
      fVar20 = pfVar43[2];
      fVar21 = pfVar43[3];
      fVar109 = fVar107 * fVar104;
      fVar22 = pfVar43[0x1d];
      fVar23 = pfVar43[0x1e];
      fVar24 = pfVar43[0x1f];
      fVar96 = fVar84 * 3.0 * fVar104;
      fVar25 = pfVar43[0x11];
      fVar26 = pfVar43[0x12];
      fVar27 = pfVar43[0x13];
      fVar99 = fVar84 * fVar84;
      fVar28 = pfVar43[0x2d];
      fVar29 = pfVar43[0x2e];
      fVar30 = pfVar43[0x2f];
      fVar106 = fVar99 * 3.0;
      fVar31 = pfVar43[0x21];
      fVar32 = pfVar43[0x22];
      fVar33 = pfVar43[0x23];
      fVar101 = fVar107 * fVar106;
      fVar34 = pfVar43[0x3d];
      fVar35 = pfVar43[0x3e];
      fVar36 = pfVar43[0x3f];
      fVar37 = pfVar43[0x39];
      fVar38 = pfVar43[0x3a];
      fVar39 = pfVar43[0x3b];
      fVar66 = pfVar43[0x35];
      fVar54 = pfVar43[0x36];
      fVar53 = pfVar43[0x37];
      fVar57 = pfVar43[0x31];
      fVar56 = pfVar43[0x32];
      fVar60 = pfVar43[0x33];
      fVar58 = fVar84 * fVar99;
      (pvVar4->field_0).v[0] =
           (fVar58 * (fVar113 * pfVar43[0x30] +
                     fVar112 * pfVar43[0x34] + fVar111 * pfVar43[0x38] + fVar95 * pfVar43[0x3c]) +
            (pfVar43[0x20] * fVar113 + fVar72 * fVar112 + fVar78 * fVar111 + pfVar43[0x2c] * fVar95)
            * fVar101 +
            (pfVar43[0x10] * fVar113 + fVar76 * fVar112 + fVar68 * fVar111 + pfVar43[0x1c] * fVar95)
            * fVar96 +
           (*pfVar43 * fVar113 + pfVar43[4] * fVar112 + pfVar43[8] * fVar111 + pfVar43[0xc] * fVar95
           ) * fVar109) * dscale;
      (pvVar4->field_0).v[1] =
           (fVar58 * (fVar113 * fVar57 + fVar112 * fVar66 + fVar111 * fVar37 + fVar95 * fVar34) +
            (fVar31 * fVar113 + fVar74 * fVar112 + fVar82 * fVar111 + fVar28 * fVar95) * fVar101 +
            (fVar25 * fVar113 + fVar94 * fVar112 + fVar69 * fVar111 + fVar22 * fVar95) * fVar96 +
           (fVar19 * fVar113 + fVar16 * fVar112 + fVar13 * fVar111 + fVar85 * fVar95) * fVar109) *
           dscale;
      (pvVar4->field_0).v[2] =
           (fVar58 * (fVar113 * fVar56 + fVar112 * fVar54 + fVar111 * fVar38 + fVar95 * fVar35) +
            (fVar32 * fVar113 + fVar75 * fVar112 + fVar83 * fVar111 + fVar29 * fVar95) * fVar101 +
            (fVar26 * fVar113 + fVar65 * fVar112 + fVar70 * fVar111 + fVar23 * fVar95) * fVar96 +
           (fVar20 * fVar113 + fVar17 * fVar112 + fVar14 * fVar111 + fVar100 * fVar95) * fVar109) *
           dscale;
      (pvVar4->field_0).v[3] =
           (fVar58 * (fVar113 * fVar60 + fVar112 * fVar53 + fVar111 * fVar39 + fVar95 * fVar36) +
            (fVar33 * fVar113 + fVar71 * fVar112 + fVar77 * fVar111 + fVar30 * fVar95) * fVar101 +
            (fVar27 * fVar113 + fVar59 * fVar112 + fVar67 * fVar111 + fVar24 * fVar95) * fVar96 +
           (fVar21 * fVar113 + fVar18 * fVar112 + fVar15 * fVar111 + fVar103 * fVar95) * fVar109) *
           dscale;
      fVar76 = pfVar43[0x14];
      fVar94 = pfVar43[0x15];
      fVar65 = pfVar43[0x16];
      fVar59 = pfVar43[0x17];
      fVar68 = pfVar43[0x18];
      fVar69 = pfVar43[0x19];
      fVar70 = pfVar43[0x1a];
      fVar67 = pfVar43[0x1b];
      fVar72 = pfVar43[0x24];
      fVar74 = pfVar43[0x25];
      fVar75 = pfVar43[0x26];
      fVar71 = pfVar43[0x27];
      fVar78 = pfVar43[0x28];
      fVar82 = pfVar43[0x29];
      fVar83 = pfVar43[0x2a];
      fVar77 = pfVar43[0x2b];
      if ((fVar84 == 1.0 || fVar84 == 0.0) || (fVar86 == 0.0 || fVar86 == 1.0)) {
        auVar63._4_4_ = auVar102._4_4_;
        auVar63._0_4_ = auVar102._4_4_;
        auVar63._8_4_ = auVar102._4_4_;
        auVar63._12_4_ = auVar102._4_4_;
      }
      else {
        fVar85 = fVar86 + fVar84;
        auVar87 = rcpss(ZEXT416((uint)fVar85),ZEXT416((uint)fVar85));
        fVar85 = (2.0 - fVar85 * auVar87._0_4_) * auVar87._0_4_;
        fVar76 = fVar85 * (pfVar43[0x40] * fVar84 + fVar76 * fVar86);
        fVar94 = fVar85 * (pfVar43[0x41] * fVar84 + fVar94 * fVar86);
        fVar65 = fVar85 * (pfVar43[0x42] * fVar84 + fVar65 * fVar86);
        fVar59 = fVar85 * (pfVar43[0x43] * fVar84 + fVar59 * fVar86);
        auVar63._4_4_ = auVar102._4_4_;
        auVar63._0_4_ = auVar102._4_4_;
        auVar63._8_4_ = auVar102._4_4_;
        auVar63._12_4_ = auVar102._4_4_;
        auVar98._4_12_ = auVar63._4_12_;
        auVar98._0_4_ = auVar102._4_4_ + fVar84;
        auVar102._0_4_ = auVar98._0_4_;
        auVar102._8_4_ = auVar102._4_4_;
        auVar102._12_4_ = auVar102._4_4_;
        auVar87 = rcpss(auVar102,auVar98);
        fVar85 = (2.0 - auVar98._0_4_ * auVar87._0_4_) * auVar87._0_4_;
        fVar68 = fVar85 * (fVar84 * fVar68 + pfVar43[0x44] * auVar102._4_4_);
        fVar69 = fVar85 * (fVar84 * fVar69 + pfVar43[0x45] * auVar102._4_4_);
        fVar70 = fVar85 * (fVar84 * fVar70 + pfVar43[0x46] * auVar102._4_4_);
        fVar67 = fVar85 * (fVar84 * fVar67 + pfVar43[0x47] * auVar102._4_4_);
        fVar85 = (2.0 - fVar86) - fVar84;
        auVar87 = rcpss(ZEXT416((uint)fVar85),ZEXT416((uint)fVar85));
        fVar85 = (2.0 - fVar85 * auVar87._0_4_) * auVar87._0_4_;
        fVar78 = fVar85 * (pfVar43[0x4c] * fVar107 + fVar78 * auVar102._4_4_);
        fVar82 = fVar85 * (pfVar43[0x4d] * fVar107 + fVar82 * auVar102._4_4_);
        fVar83 = fVar85 * (pfVar43[0x4e] * fVar107 + fVar83 * auVar102._4_4_);
        fVar77 = fVar85 * (pfVar43[0x4f] * fVar107 + fVar77 * auVar102._4_4_);
        fVar85 = (fVar86 + 1.0) - fVar84;
        auVar87 = rcpss(ZEXT416((uint)fVar85),ZEXT416((uint)fVar85));
        fVar85 = (2.0 - fVar85 * auVar87._0_4_) * auVar87._0_4_;
        fVar72 = fVar85 * (fVar107 * fVar72 + fVar86 * pfVar43[0x48]);
        fVar74 = fVar85 * (fVar107 * fVar74 + fVar86 * pfVar43[0x49]);
        fVar75 = fVar85 * (fVar107 * fVar75 + fVar86 * pfVar43[0x4a]);
        fVar71 = fVar85 * (fVar107 * fVar71 + fVar86 * pfVar43[0x4b]);
      }
      fVar58 = auVar63._0_4_ * fVar55;
      fVar55 = fVar86 * 3.0 * fVar55;
      fVar95 = fVar95 * auVar63._0_4_;
      fVar91 = fVar91 * fVar86;
      fVar85 = fVar84 * fVar107 + fVar84 * fVar107;
      fVar96 = (fVar104 - fVar85) * 3.0;
      fVar109 = (fVar85 - fVar99) * 3.0;
      fVar85 = pfVar43[0xd];
      fVar100 = pfVar43[0xe];
      fVar103 = pfVar43[0xf];
      fVar13 = pfVar43[9];
      fVar14 = pfVar43[10];
      fVar15 = pfVar43[0xb];
      fVar16 = pfVar43[5];
      fVar17 = pfVar43[6];
      fVar18 = pfVar43[7];
      fVar19 = pfVar43[1];
      fVar20 = pfVar43[2];
      fVar21 = pfVar43[3];
      fVar104 = fVar104 * -3.0;
      fVar22 = pfVar43[0x1d];
      fVar23 = pfVar43[0x1e];
      fVar24 = pfVar43[0x1f];
      fVar25 = pfVar43[0x11];
      fVar26 = pfVar43[0x12];
      fVar27 = pfVar43[0x13];
      fVar28 = pfVar43[0x2d];
      fVar29 = pfVar43[0x2e];
      fVar30 = pfVar43[0x2f];
      fVar31 = pfVar43[0x21];
      fVar32 = pfVar43[0x22];
      fVar33 = pfVar43[0x23];
      fVar34 = pfVar43[0x3d];
      fVar35 = pfVar43[0x3e];
      fVar36 = pfVar43[0x3f];
      fVar37 = pfVar43[0x39];
      fVar38 = pfVar43[0x3a];
      fVar39 = pfVar43[0x3b];
      fVar66 = pfVar43[0x35];
      fVar54 = pfVar43[0x36];
      fVar53 = pfVar43[0x37];
      fVar57 = pfVar43[0x31];
      fVar56 = pfVar43[0x32];
      fVar60 = pfVar43[0x33];
      (pvVar5->field_0).v[0] =
           dscale * (fVar106 * (fVar58 * pfVar43[0x30] +
                               fVar55 * pfVar43[0x34] +
                               fVar95 * pfVar43[0x38] + fVar91 * pfVar43[0x3c]) +
                     (pfVar43[0x20] * fVar58 +
                     fVar72 * fVar55 + fVar78 * fVar95 + pfVar43[0x2c] * fVar91) * fVar109 +
                     (pfVar43[0x10] * fVar58 +
                     fVar76 * fVar55 + fVar68 * fVar95 + pfVar43[0x1c] * fVar91) * fVar96 +
                    (*pfVar43 * fVar58 +
                    pfVar43[4] * fVar55 + pfVar43[8] * fVar95 + pfVar43[0xc] * fVar91) * fVar104);
      (pvVar5->field_0).v[1] =
           dscale * (fVar106 * (fVar58 * fVar57 +
                               fVar55 * fVar66 + fVar95 * fVar37 + fVar91 * fVar34) +
                     (fVar31 * fVar58 + fVar74 * fVar55 + fVar82 * fVar95 + fVar28 * fVar91) *
                     fVar109 + (fVar25 * fVar58 +
                               fVar94 * fVar55 + fVar69 * fVar95 + fVar22 * fVar91) * fVar96 +
                    (fVar19 * fVar58 + fVar16 * fVar55 + fVar13 * fVar95 + fVar85 * fVar91) *
                    fVar104);
      (pvVar5->field_0).v[2] =
           dscale * (fVar106 * (fVar58 * fVar56 +
                               fVar55 * fVar54 + fVar95 * fVar38 + fVar91 * fVar35) +
                     (fVar32 * fVar58 + fVar75 * fVar55 + fVar83 * fVar95 + fVar29 * fVar91) *
                     fVar109 + (fVar26 * fVar58 +
                               fVar65 * fVar55 + fVar70 * fVar95 + fVar23 * fVar91) * fVar96 +
                    (fVar20 * fVar58 + fVar17 * fVar55 + fVar14 * fVar95 + fVar100 * fVar91) *
                    fVar104);
      (pvVar5->field_0).v[3] =
           dscale * (fVar106 * (fVar58 * fVar60 +
                               fVar55 * fVar53 + fVar95 * fVar39 + fVar91 * fVar36) +
                     (fVar33 * fVar58 + fVar71 * fVar55 + fVar77 * fVar95 + fVar30 * fVar91) *
                     fVar109 + (fVar27 * fVar58 +
                               fVar59 * fVar55 + fVar67 * fVar95 + fVar24 * fVar91) * fVar96 +
                    (fVar21 * fVar58 + fVar18 * fVar55 + fVar15 * fVar95 + fVar103 * fVar91) *
                    fVar104);
    }
    bVar52 = true;
    if (pvVar6 != (vfloat_impl<4> *)0x0) {
      bVar11 = fVar86 != 1.0;
      bVar12 = fVar86 != 0.0;
      bVar9 = fVar84 != 0.0;
      bVar10 = fVar84 != 1.0;
      fVar76 = pfVar43[0x14];
      fVar94 = pfVar43[0x15];
      fVar65 = pfVar43[0x16];
      fVar59 = pfVar43[0x17];
      fVar68 = pfVar43[0x18];
      fVar69 = pfVar43[0x19];
      fVar70 = pfVar43[0x1a];
      fVar67 = pfVar43[0x1b];
      fVar72 = pfVar43[0x24];
      fVar74 = pfVar43[0x25];
      fVar75 = pfVar43[0x26];
      fVar71 = pfVar43[0x27];
      fVar78 = pfVar43[0x28];
      fVar82 = pfVar43[0x29];
      fVar83 = pfVar43[0x2a];
      fVar77 = pfVar43[0x2b];
      if ((bVar10 && bVar9) && (bVar12 && bVar11)) {
        fVar85 = fVar86 + fVar84;
        auVar87 = rcpss(ZEXT416((uint)fVar85),ZEXT416((uint)fVar85));
        fVar100 = 1.0 - fVar84;
        fVar103 = 1.0 - fVar86;
        fVar85 = (2.0 - fVar85 * auVar87._0_4_) * auVar87._0_4_;
        fVar76 = fVar85 * (pfVar43[0x40] * fVar84 + fVar76 * fVar86);
        fVar94 = fVar85 * (pfVar43[0x41] * fVar84 + fVar94 * fVar86);
        fVar65 = fVar85 * (pfVar43[0x42] * fVar84 + fVar65 * fVar86);
        fVar59 = fVar85 * (pfVar43[0x43] * fVar84 + fVar59 * fVar86);
        auVar80._4_4_ = fVar103;
        auVar80._0_4_ = fVar103;
        auVar80._8_4_ = fVar103;
        auVar80._12_4_ = fVar103;
        auVar81._4_12_ = auVar80._4_12_;
        auVar81._0_4_ = fVar103 + fVar84;
        auVar88._4_4_ = fVar103;
        auVar88._0_4_ = auVar81._0_4_;
        auVar88._8_4_ = fVar103;
        auVar88._12_4_ = fVar103;
        auVar87 = rcpss(auVar88,auVar81);
        fVar85 = (2.0 - auVar81._0_4_ * auVar87._0_4_) * auVar87._0_4_;
        fVar68 = fVar85 * (fVar84 * fVar68 + pfVar43[0x44] * fVar103);
        fVar69 = fVar85 * (fVar84 * fVar69 + pfVar43[0x45] * fVar103);
        fVar70 = fVar85 * (fVar84 * fVar70 + pfVar43[0x46] * fVar103);
        fVar67 = fVar85 * (fVar84 * fVar67 + pfVar43[0x47] * fVar103);
        fVar85 = (2.0 - fVar86) - fVar84;
        auVar87 = rcpss(ZEXT416((uint)fVar85),ZEXT416((uint)fVar85));
        fVar85 = (2.0 - fVar85 * auVar87._0_4_) * auVar87._0_4_;
        fVar78 = fVar85 * (pfVar43[0x4c] * fVar100 + fVar103 * fVar78);
        fVar82 = fVar85 * (pfVar43[0x4d] * fVar100 + fVar103 * fVar82);
        fVar83 = fVar85 * (pfVar43[0x4e] * fVar100 + fVar103 * fVar83);
        fVar77 = fVar85 * (pfVar43[0x4f] * fVar100 + fVar103 * fVar77);
        fVar85 = (fVar86 + 1.0) - fVar84;
        auVar87 = rcpss(ZEXT416((uint)fVar85),ZEXT416((uint)fVar85));
        fVar85 = (2.0 - fVar85 * auVar87._0_4_) * auVar87._0_4_;
        fVar72 = fVar85 * (fVar100 * fVar72 + fVar86 * pfVar43[0x48]);
        fVar74 = fVar85 * (fVar100 * fVar74 + fVar86 * pfVar43[0x49]);
        fVar75 = fVar85 * (fVar100 * fVar75 + fVar86 * pfVar43[0x4a]);
        fVar71 = fVar85 * (fVar100 * fVar71 + fVar86 * pfVar43[0x4b]);
      }
      fVar101 = 1.0 - fVar86;
      fVar96 = 1.0 - fVar84;
      fVar107 = fVar101 * 6.0;
      fVar99 = (fVar86 - (fVar101 + fVar101)) * 6.0;
      fVar111 = (fVar101 - (fVar86 + fVar86)) * 6.0;
      fVar55 = fVar86 * 6.0;
      fVar112 = fVar96 * fVar96;
      fVar85 = pfVar43[0xd];
      fVar100 = pfVar43[0xe];
      fVar103 = pfVar43[0xf];
      fVar13 = pfVar43[9];
      fVar14 = pfVar43[10];
      fVar15 = pfVar43[0xb];
      fVar16 = pfVar43[5];
      fVar17 = pfVar43[6];
      fVar18 = pfVar43[7];
      fVar19 = pfVar43[1];
      fVar20 = pfVar43[2];
      fVar21 = pfVar43[3];
      fVar91 = fVar96 * fVar112;
      fVar22 = pfVar43[0x1d];
      fVar23 = pfVar43[0x1e];
      fVar24 = pfVar43[0x1f];
      fVar104 = fVar84 * 3.0 * fVar112;
      fVar25 = pfVar43[0x11];
      fVar26 = pfVar43[0x12];
      fVar27 = pfVar43[0x13];
      fVar113 = fVar84 * fVar84;
      fVar28 = pfVar43[0x2d];
      fVar29 = pfVar43[0x2e];
      fVar30 = pfVar43[0x2f];
      fVar95 = fVar113 * 3.0;
      fVar31 = pfVar43[0x21];
      fVar32 = pfVar43[0x22];
      fVar33 = pfVar43[0x23];
      fVar106 = fVar96 * fVar95;
      fVar34 = pfVar43[0x3d];
      fVar35 = pfVar43[0x3e];
      fVar36 = pfVar43[0x3f];
      fVar37 = pfVar43[0x39];
      fVar38 = pfVar43[0x3a];
      fVar39 = pfVar43[0x3b];
      fVar66 = pfVar43[0x35];
      fVar54 = pfVar43[0x36];
      fVar53 = pfVar43[0x37];
      fVar57 = pfVar43[0x31];
      fVar56 = pfVar43[0x32];
      fVar60 = pfVar43[0x33];
      fVar58 = fVar84 * fVar113;
      fVar109 = dscale * dscale;
      (pvVar6->field_0).v[0] =
           (fVar58 * (fVar107 * pfVar43[0x30] +
                     fVar99 * pfVar43[0x34] + fVar111 * pfVar43[0x38] + fVar55 * pfVar43[0x3c]) +
            (pfVar43[0x20] * fVar107 + fVar72 * fVar99 + fVar78 * fVar111 + pfVar43[0x2c] * fVar55)
            * fVar106 +
            (pfVar43[0x10] * fVar107 + fVar76 * fVar99 + fVar68 * fVar111 + pfVar43[0x1c] * fVar55)
            * fVar104 +
           (*pfVar43 * fVar107 + pfVar43[4] * fVar99 + pfVar43[8] * fVar111 + pfVar43[0xc] * fVar55)
           * fVar91) * fVar109;
      (pvVar6->field_0).v[1] =
           (fVar58 * (fVar107 * fVar57 + fVar99 * fVar66 + fVar111 * fVar37 + fVar55 * fVar34) +
            (fVar31 * fVar107 + fVar74 * fVar99 + fVar82 * fVar111 + fVar28 * fVar55) * fVar106 +
            (fVar25 * fVar107 + fVar94 * fVar99 + fVar69 * fVar111 + fVar22 * fVar55) * fVar104 +
           (fVar19 * fVar107 + fVar16 * fVar99 + fVar13 * fVar111 + fVar85 * fVar55) * fVar91) *
           fVar109;
      (pvVar6->field_0).v[2] =
           (fVar58 * (fVar107 * fVar56 + fVar99 * fVar54 + fVar111 * fVar38 + fVar55 * fVar35) +
            (fVar32 * fVar107 + fVar75 * fVar99 + fVar83 * fVar111 + fVar29 * fVar55) * fVar106 +
            (fVar26 * fVar107 + fVar65 * fVar99 + fVar70 * fVar111 + fVar23 * fVar55) * fVar104 +
           (fVar20 * fVar107 + fVar17 * fVar99 + fVar14 * fVar111 + fVar100 * fVar55) * fVar91) *
           fVar109;
      (pvVar6->field_0).v[3] =
           (fVar58 * (fVar107 * fVar60 + fVar99 * fVar53 + fVar111 * fVar39 + fVar55 * fVar36) +
            (fVar33 * fVar107 + fVar71 * fVar99 + fVar77 * fVar111 + fVar30 * fVar55) * fVar106 +
            (fVar27 * fVar107 + fVar59 * fVar99 + fVar67 * fVar111 + fVar24 * fVar55) * fVar104 +
           (fVar21 * fVar107 + fVar18 * fVar99 + fVar15 * fVar111 + fVar103 * fVar55) * fVar91) *
           fVar109;
      fVar76 = pfVar43[0x14];
      fVar94 = pfVar43[0x15];
      fVar65 = pfVar43[0x16];
      fVar59 = pfVar43[0x17];
      fVar68 = pfVar43[0x18];
      fVar69 = pfVar43[0x19];
      fVar70 = pfVar43[0x1a];
      fVar67 = pfVar43[0x1b];
      fVar72 = pfVar43[0x24];
      fVar74 = pfVar43[0x25];
      fVar75 = pfVar43[0x26];
      fVar71 = pfVar43[0x27];
      fVar78 = pfVar43[0x28];
      fVar82 = pfVar43[0x29];
      fVar83 = pfVar43[0x2a];
      fVar77 = pfVar43[0x2b];
      if ((bVar10 && bVar9) && (bVar12 && bVar11)) {
        fVar85 = fVar86 + fVar84;
        auVar87 = rcpss(ZEXT416((uint)fVar85),ZEXT416((uint)fVar85));
        fVar85 = (2.0 - fVar85 * auVar87._0_4_) * auVar87._0_4_;
        fVar76 = fVar85 * (pfVar43[0x40] * fVar84 + fVar76 * fVar86);
        fVar94 = fVar85 * (pfVar43[0x41] * fVar84 + fVar94 * fVar86);
        fVar65 = fVar85 * (pfVar43[0x42] * fVar84 + fVar65 * fVar86);
        fVar59 = fVar85 * (pfVar43[0x43] * fVar84 + fVar59 * fVar86);
        auVar89._4_4_ = fVar101;
        auVar89._0_4_ = fVar101;
        auVar89._8_4_ = fVar101;
        auVar89._12_4_ = fVar101;
        auVar90._4_12_ = auVar89._4_12_;
        auVar90._0_4_ = fVar101 + fVar84;
        auVar93._4_4_ = fVar101;
        auVar93._0_4_ = auVar90._0_4_;
        auVar93._8_4_ = fVar101;
        auVar93._12_4_ = fVar101;
        auVar87 = rcpss(auVar93,auVar90);
        fVar85 = (2.0 - auVar90._0_4_ * auVar87._0_4_) * auVar87._0_4_;
        fVar68 = fVar85 * (fVar84 * fVar68 + pfVar43[0x44] * fVar101);
        fVar69 = fVar85 * (fVar84 * fVar69 + pfVar43[0x45] * fVar101);
        fVar70 = fVar85 * (fVar84 * fVar70 + pfVar43[0x46] * fVar101);
        fVar67 = fVar85 * (fVar84 * fVar67 + pfVar43[0x47] * fVar101);
        fVar85 = (2.0 - fVar86) - fVar84;
        auVar87 = rcpss(ZEXT416((uint)fVar85),ZEXT416((uint)fVar85));
        fVar85 = (2.0 - fVar85 * auVar87._0_4_) * auVar87._0_4_;
        fVar78 = fVar85 * (pfVar43[0x4c] * fVar96 + fVar78 * fVar101);
        fVar82 = fVar85 * (pfVar43[0x4d] * fVar96 + fVar82 * fVar101);
        fVar83 = fVar85 * (pfVar43[0x4e] * fVar96 + fVar83 * fVar101);
        fVar77 = fVar85 * (pfVar43[0x4f] * fVar96 + fVar77 * fVar101);
        fVar85 = (fVar86 + 1.0) - fVar84;
        auVar87 = rcpss(ZEXT416((uint)fVar85),ZEXT416((uint)fVar85));
        fVar85 = (2.0 - fVar85 * auVar87._0_4_) * auVar87._0_4_;
        fVar72 = (fVar72 * fVar96 + fVar86 * pfVar43[0x48]) * fVar85;
        fVar74 = (fVar74 * fVar96 + fVar86 * pfVar43[0x49]) * fVar85;
        fVar75 = (fVar75 * fVar96 + fVar86 * pfVar43[0x4a]) * fVar85;
        fVar71 = (fVar71 * fVar96 + fVar86 * pfVar43[0x4b]) * fVar85;
      }
      fVar111 = fVar101 * fVar101;
      fVar104 = fVar101 * fVar111;
      fVar55 = fVar86 * 3.0 * fVar111;
      fVar108 = fVar86 * fVar86;
      fVar91 = fVar108 * 3.0;
      fVar58 = fVar101 * fVar91;
      fVar106 = fVar86 * fVar108;
      fVar85 = pfVar43[0xd];
      fVar100 = pfVar43[0xe];
      fVar103 = pfVar43[0xf];
      fVar13 = pfVar43[9];
      fVar14 = pfVar43[10];
      fVar15 = pfVar43[0xb];
      fVar16 = pfVar43[5];
      fVar17 = pfVar43[6];
      fVar18 = pfVar43[7];
      fVar19 = pfVar43[1];
      fVar20 = pfVar43[2];
      fVar21 = pfVar43[3];
      fVar105 = fVar96 * 6.0;
      fVar22 = pfVar43[0x1d];
      fVar23 = pfVar43[0x1e];
      fVar24 = pfVar43[0x1f];
      fVar25 = pfVar43[0x11];
      fVar26 = pfVar43[0x12];
      fVar27 = pfVar43[0x13];
      fVar110 = (fVar84 - (fVar96 + fVar96)) * 6.0;
      fVar28 = pfVar43[0x2d];
      fVar29 = pfVar43[0x2e];
      fVar30 = pfVar43[0x2f];
      fVar31 = pfVar43[0x21];
      fVar32 = pfVar43[0x22];
      fVar33 = pfVar43[0x23];
      fVar99 = (fVar96 - (fVar84 + fVar84)) * 6.0;
      fVar34 = pfVar43[0x3d];
      fVar35 = pfVar43[0x3e];
      fVar36 = pfVar43[0x3f];
      fVar37 = pfVar43[0x39];
      fVar38 = pfVar43[0x3a];
      fVar39 = pfVar43[0x3b];
      fVar66 = pfVar43[0x35];
      fVar54 = pfVar43[0x36];
      fVar53 = pfVar43[0x37];
      fVar57 = pfVar43[0x31];
      fVar56 = pfVar43[0x32];
      fVar60 = pfVar43[0x33];
      fVar107 = fVar84 * 6.0;
      (pvVar7->field_0).v[0] =
           (fVar107 * (fVar104 * pfVar43[0x30] +
                      fVar55 * pfVar43[0x34] + fVar58 * pfVar43[0x38] + fVar106 * pfVar43[0x3c]) +
            (pfVar43[0x20] * fVar104 + fVar72 * fVar55 + fVar78 * fVar58 + pfVar43[0x2c] * fVar106)
            * fVar99 +
            (pfVar43[0x10] * fVar104 + fVar76 * fVar55 + fVar68 * fVar58 + pfVar43[0x1c] * fVar106)
            * fVar110 +
           (*pfVar43 * fVar104 + pfVar43[4] * fVar55 + pfVar43[8] * fVar58 + pfVar43[0xc] * fVar106)
           * fVar105) * fVar109;
      (pvVar7->field_0).v[1] =
           (fVar107 * (fVar104 * fVar57 + fVar55 * fVar66 + fVar58 * fVar37 + fVar106 * fVar34) +
            (fVar31 * fVar104 + fVar74 * fVar55 + fVar82 * fVar58 + fVar28 * fVar106) * fVar99 +
            (fVar25 * fVar104 + fVar94 * fVar55 + fVar69 * fVar58 + fVar22 * fVar106) * fVar110 +
           (fVar19 * fVar104 + fVar16 * fVar55 + fVar13 * fVar58 + fVar85 * fVar106) * fVar105) *
           fVar109;
      (pvVar7->field_0).v[2] =
           (fVar107 * (fVar104 * fVar56 + fVar55 * fVar54 + fVar58 * fVar38 + fVar106 * fVar35) +
            (fVar32 * fVar104 + fVar75 * fVar55 + fVar83 * fVar58 + fVar29 * fVar106) * fVar99 +
            (fVar26 * fVar104 + fVar65 * fVar55 + fVar70 * fVar58 + fVar23 * fVar106) * fVar110 +
           (fVar20 * fVar104 + fVar17 * fVar55 + fVar14 * fVar58 + fVar100 * fVar106) * fVar105) *
           fVar109;
      (pvVar7->field_0).v[3] =
           (fVar107 * (fVar104 * fVar60 + fVar55 * fVar53 + fVar58 * fVar39 + fVar106 * fVar36) +
            (fVar33 * fVar104 + fVar71 * fVar55 + fVar77 * fVar58 + fVar30 * fVar106) * fVar99 +
            (fVar27 * fVar104 + fVar59 * fVar55 + fVar67 * fVar58 + fVar24 * fVar106) * fVar110 +
           (fVar21 * fVar104 + fVar18 * fVar55 + fVar15 * fVar58 + fVar103 * fVar106) * fVar105) *
           fVar109;
      fVar76 = pfVar43[0x14];
      fVar94 = pfVar43[0x15];
      fVar65 = pfVar43[0x16];
      fVar59 = pfVar43[0x17];
      fVar68 = pfVar43[0x18];
      fVar69 = pfVar43[0x19];
      fVar70 = pfVar43[0x1a];
      fVar67 = pfVar43[0x1b];
      fVar72 = pfVar43[0x24];
      fVar74 = pfVar43[0x25];
      fVar75 = pfVar43[0x26];
      fVar71 = pfVar43[0x27];
      fVar78 = pfVar43[0x28];
      fVar82 = pfVar43[0x29];
      fVar83 = pfVar43[0x2a];
      fVar77 = pfVar43[0x2b];
      if ((bVar10 && bVar9) && (bVar12 && bVar11)) {
        fVar85 = fVar86 + fVar84;
        auVar87 = rcpss(ZEXT416((uint)fVar85),ZEXT416((uint)fVar85));
        fVar85 = (2.0 - fVar85 * auVar87._0_4_) * auVar87._0_4_;
        fVar76 = fVar85 * (pfVar43[0x40] * fVar84 + fVar76 * fVar86);
        fVar94 = fVar85 * (pfVar43[0x41] * fVar84 + fVar94 * fVar86);
        fVar65 = fVar85 * (pfVar43[0x42] * fVar84 + fVar65 * fVar86);
        fVar59 = fVar85 * (pfVar43[0x43] * fVar84 + fVar59 * fVar86);
        auVar41._4_4_ = fVar101;
        auVar41._0_4_ = fVar101;
        auVar41._8_4_ = fVar101;
        auVar41._12_4_ = fVar101;
        auVar64._4_12_ = auVar41._4_12_;
        auVar64._0_4_ = fVar101 + fVar84;
        auVar73._4_4_ = fVar101;
        auVar73._0_4_ = auVar64._0_4_;
        auVar73._8_4_ = fVar101;
        auVar73._12_4_ = fVar101;
        auVar87 = rcpss(auVar73,auVar64);
        fVar85 = (2.0 - auVar64._0_4_ * auVar87._0_4_) * auVar87._0_4_;
        fVar68 = fVar85 * (fVar84 * fVar68 + pfVar43[0x44] * fVar101);
        fVar69 = fVar85 * (fVar84 * fVar69 + pfVar43[0x45] * fVar101);
        fVar70 = fVar85 * (fVar84 * fVar70 + pfVar43[0x46] * fVar101);
        fVar67 = fVar85 * (fVar84 * fVar67 + pfVar43[0x47] * fVar101);
        fVar85 = (2.0 - fVar86) - fVar84;
        auVar87 = rcpss(ZEXT416((uint)fVar85),ZEXT416((uint)fVar85));
        fVar85 = (2.0 - fVar85 * auVar87._0_4_) * auVar87._0_4_;
        fVar78 = fVar85 * (pfVar43[0x4c] * fVar96 + fVar78 * fVar101);
        fVar82 = fVar85 * (pfVar43[0x4d] * fVar96 + fVar82 * fVar101);
        fVar83 = fVar85 * (pfVar43[0x4e] * fVar96 + fVar83 * fVar101);
        fVar77 = fVar85 * (pfVar43[0x4f] * fVar96 + fVar77 * fVar101);
        fVar85 = (fVar86 + 1.0) - fVar84;
        auVar87 = rcpss(ZEXT416((uint)fVar85),ZEXT416((uint)fVar85));
        fVar85 = (2.0 - fVar85 * auVar87._0_4_) * auVar87._0_4_;
        fVar72 = (fVar72 * fVar96 + fVar86 * pfVar43[0x48]) * fVar85;
        fVar74 = (fVar74 * fVar96 + fVar86 * pfVar43[0x49]) * fVar85;
        fVar75 = (fVar75 * fVar96 + fVar86 * pfVar43[0x4a]) * fVar85;
        fVar71 = (fVar71 * fVar96 + fVar86 * pfVar43[0x4b]) * fVar85;
      }
      fVar86 = fVar86 * fVar101 + fVar86 * fVar101;
      fVar99 = fVar111 * -3.0;
      fVar56 = (fVar111 - fVar86) * 3.0;
      fVar55 = (fVar86 - fVar108) * 3.0;
      fVar86 = fVar84 * fVar96 + fVar84 * fVar96;
      fVar58 = fVar112 * -3.0;
      fVar60 = (fVar112 - fVar86) * 3.0;
      fVar104 = (fVar86 - fVar113) * 3.0;
      fVar86 = pfVar43[0xd];
      fVar84 = pfVar43[0xe];
      fVar85 = pfVar43[0xf];
      fVar100 = pfVar43[9];
      fVar103 = pfVar43[10];
      fVar13 = pfVar43[0xb];
      fVar14 = pfVar43[5];
      fVar15 = pfVar43[6];
      fVar16 = pfVar43[7];
      fVar17 = pfVar43[1];
      fVar18 = pfVar43[2];
      fVar19 = pfVar43[3];
      fVar20 = pfVar43[0x1d];
      fVar21 = pfVar43[0x1e];
      fVar22 = pfVar43[0x1f];
      fVar23 = pfVar43[0x11];
      fVar24 = pfVar43[0x12];
      fVar25 = pfVar43[0x13];
      fVar26 = pfVar43[0x2d];
      fVar27 = pfVar43[0x2e];
      fVar28 = pfVar43[0x2f];
      fVar29 = pfVar43[0x21];
      fVar30 = pfVar43[0x22];
      fVar31 = pfVar43[0x23];
      fVar32 = pfVar43[0x3d];
      fVar33 = pfVar43[0x3e];
      fVar34 = pfVar43[0x3f];
      fVar35 = pfVar43[0x39];
      fVar36 = pfVar43[0x3a];
      fVar37 = pfVar43[0x3b];
      fVar38 = pfVar43[0x35];
      fVar39 = pfVar43[0x36];
      fVar66 = pfVar43[0x37];
      fVar54 = pfVar43[0x31];
      fVar53 = pfVar43[0x32];
      fVar57 = pfVar43[0x33];
      (pvVar8->field_0).v[0] =
           fVar109 * (fVar95 * (fVar99 * pfVar43[0x30] +
                               fVar56 * pfVar43[0x34] +
                               fVar55 * pfVar43[0x38] + fVar91 * pfVar43[0x3c]) +
                      (pfVar43[0x20] * fVar99 +
                      fVar72 * fVar56 + fVar78 * fVar55 + pfVar43[0x2c] * fVar91) * fVar104 +
                      (pfVar43[0x10] * fVar99 +
                      fVar76 * fVar56 + fVar68 * fVar55 + pfVar43[0x1c] * fVar91) * fVar60 +
                     (*pfVar43 * fVar99 +
                     pfVar43[4] * fVar56 + pfVar43[8] * fVar55 + pfVar43[0xc] * fVar91) * fVar58);
      (pvVar8->field_0).v[1] =
           fVar109 * (fVar95 * (fVar99 * fVar54 +
                               fVar56 * fVar38 + fVar55 * fVar35 + fVar91 * fVar32) +
                      (fVar29 * fVar99 + fVar74 * fVar56 + fVar82 * fVar55 + fVar26 * fVar91) *
                      fVar104 + (fVar23 * fVar99 +
                                fVar94 * fVar56 + fVar69 * fVar55 + fVar20 * fVar91) * fVar60 +
                     (fVar17 * fVar99 + fVar14 * fVar56 + fVar100 * fVar55 + fVar86 * fVar91) *
                     fVar58);
      (pvVar8->field_0).v[2] =
           fVar109 * (fVar95 * (fVar99 * fVar53 +
                               fVar56 * fVar39 + fVar55 * fVar36 + fVar91 * fVar33) +
                      (fVar30 * fVar99 + fVar75 * fVar56 + fVar83 * fVar55 + fVar27 * fVar91) *
                      fVar104 + (fVar24 * fVar99 +
                                fVar65 * fVar56 + fVar70 * fVar55 + fVar21 * fVar91) * fVar60 +
                     (fVar18 * fVar99 + fVar15 * fVar56 + fVar103 * fVar55 + fVar84 * fVar91) *
                     fVar58);
      (pvVar8->field_0).v[3] =
           fVar109 * (fVar95 * (fVar99 * fVar57 +
                               fVar56 * fVar66 + fVar55 * fVar37 + fVar91 * fVar34) +
                      (fVar31 * fVar99 + fVar71 * fVar56 + fVar77 * fVar55 + fVar28 * fVar91) *
                      fVar104 + (fVar25 * fVar99 +
                                fVar59 * fVar56 + fVar67 * fVar55 + fVar22 * fVar91) * fVar60 +
                     (fVar19 * fVar99 + fVar16 * fVar56 + fVar13 * fVar55 + fVar85 * fVar91) *
                     fVar58);
    }
    break;
  case 7:
    bVar52 = eval_general(this,(SubdividedGeneralPatch *)(This.ptr & 0xfffffffffffffff0),*u,*v,depth
                         );
    break;
  case 8:
    psVar48 = (size_t *)(This.ptr & 0xfffffffffffffff0);
    local_d80.ring.items[0].border_index = (int)*u;
    fVar86 = *v;
    if (0.5 <= fVar86) {
      local_e38.field_0.x = fVar86 + fVar86 + -1.0;
      if ((float)local_d80.ring.items[0].border_index <= 0.5) {
        This_00.ptr = psVar48[3];
        local_d80.ring.items[0].border_index =
             (int)((float)local_d80.ring.items[0].border_index +
                  (float)local_d80.ring.items[0].border_index);
      }
      else {
        This_00.ptr = psVar48[2];
        local_d80.ring.items[0].border_index =
             (int)((float)local_d80.ring.items[0].border_index +
                   (float)local_d80.ring.items[0].border_index + -1.0);
      }
    }
    else {
      if (0.5 <= (float)local_d80.ring.items[0].border_index) {
        local_d80.ring.items[0].border_index =
             (int)((float)local_d80.ring.items[0].border_index +
                   (float)local_d80.ring.items[0].border_index + -1.0);
        This_00.ptr = psVar48[1];
      }
      else {
        This_00.ptr = *psVar48;
        local_d80.ring.items[0].border_index =
             (int)((float)local_d80.ring.items[0].border_index +
                  (float)local_d80.ring.items[0].border_index);
      }
      local_e38.field_0.x = fVar86 + fVar86;
    }
    bVar52 = eval(this,This_00,(float *)&local_d80,local_e38.components,dscale + dscale,depth + 1);
    break;
  case 9:
    uStack_de8 = local_df0;
    local_df0 = u;
    pDVar46 = &local_d80.ring.items[0].ring;
    pDVar47 = &local_d80.ring.items[0].crease_weight;
    lVar42 = 0;
    do {
      *(long *)((long)local_d80.ring.items[0].crease_weight.arr + lVar42 + 0x40) =
           (long)pDVar47->arr + lVar42;
      *(undefined8 *)((long)local_d80.ring.items[0].ring.arr + lVar42 + -0x38) = 0;
      *(long *)((long)&local_d80.ring.items[0].ring.data + lVar42) =
           (long)&pDVar46->arr[0].field_0 + lVar42;
      lVar42 = lVar42 + 0x340;
    } while (lVar42 != 0xd00);
    uVar49 = This.ptr & 0xfffffffffffffff0;
    lVar42 = 0;
    lVar51 = 0;
    local_e00 = this;
    local_de0 = v;
    do {
      local_e20 = pDVar46;
      local_d80.ring.items[lVar42].border_index = *(int *)(uVar49 + lVar51);
      uVar3 = *(uint *)(uVar49 + 4 + lVar51);
      local_d80.ring.items[lVar42].face_valence = uVar3;
      local_d80.ring.items[lVar42].edge_valence = uVar3 * 2;
      local_d80.ring.items[lVar42].vertex_crease_weight = *(float *)(uVar49 + 8 + lVar51);
      lVar51 = lVar51 + 0xc;
      if (uVar3 == 0) {
        bVar52 = true;
      }
      else {
        uVar50 = 0;
        do {
          pfVar43 = local_d80.ring.items[lVar42].crease_weight.data;
          if ((0xf < uVar50) &&
             ((DynamicStackArray<float,_16UL,_64UL> *)pfVar43 ==
              &local_d80.ring.items[lVar42].crease_weight)) {
            local_e10 = depth;
            pfVar43 = (float *)operator_new__(0x100);
            local_d80.ring.items[lVar42].crease_weight.data = pfVar43;
            lVar45 = 0;
            do {
              local_d80.ring.items[lVar42].crease_weight.data[lVar45] = pDVar47->arr[lVar45];
              lVar45 = lVar45 + 1;
            } while (lVar45 != 0x10);
            pfVar43 = local_d80.ring.items[lVar42].crease_weight.data;
            depth = local_e10;
          }
          pfVar43[uVar50] = *(float *)(uVar49 + lVar51);
          uVar50 = uVar50 + 1;
          lVar51 = lVar51 + 4;
        } while (uVar50 < local_d80.ring.items[lVar42].face_valence);
        bVar52 = local_d80.ring.items[lVar42].edge_valence == 0;
      }
      local_d80.ring.items[lVar42].vertex_level = *(float *)(uVar49 + lVar51);
      local_d80.ring.items[lVar42].edge_level = *(float *)(uVar49 + 4 + lVar51);
      local_d80.ring.items[lVar42].eval_start_index = *(uint *)(uVar49 + 8 + lVar51);
      local_d80.ring.items[lVar42].eval_unique_identifier = *(uint *)(uVar49 + 0xc + lVar51);
      puVar2 = (undefined8 *)(uVar49 + 0x10 + lVar51);
      uVar40 = puVar2[1];
      *(undefined8 *)&local_d80.ring.items[lVar42].vtx.field_0 = *puVar2;
      *(undefined8 *)((long)&local_d80.ring.items[lVar42].vtx.field_0 + 8) = uVar40;
      lVar51 = lVar51 + 0x20;
      if (!bVar52) {
        local_e30 = &local_d80.ring.items[lVar42].ring;
        uVar50 = 0;
        do {
          auVar87 = *(undefined1 (*) [16])(uVar49 + lVar51);
          pvVar44 = local_d80.ring.items[lVar42].ring.data;
          if ((0x1f < uVar50) &&
             ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar44 == local_e30)) {
            local_e10 = depth;
            pvVar44 = (vfloat_impl<4> *)alignedMalloc(0x800,0x10);
            local_d80.ring.items[lVar42].ring.data = pvVar44;
            lVar45 = 0;
            do {
              uVar40 = ((undefined8 *)((long)local_e20 + lVar45))[1];
              puVar2 = (undefined8 *)
                       ((long)&(local_d80.ring.items[lVar42].ring.data)->field_0 + lVar45);
              *puVar2 = *(undefined8 *)((long)local_e20 + lVar45);
              puVar2[1] = uVar40;
              lVar45 = lVar45 + 0x10;
            } while (lVar45 != 0x200);
            pvVar44 = local_d80.ring.items[lVar42].ring.data;
            depth = local_e10;
          }
          uVar1 = uVar50 + 1;
          local_e70 = auVar87._0_8_;
          uStack_e68 = auVar87._8_8_;
          *(undefined8 *)&pvVar44[uVar50].field_0 = local_e70;
          *(undefined8 *)((long)&pvVar44[uVar50].field_0 + 8) = uStack_e68;
          lVar51 = lVar51 + 0x10;
          uVar50 = uVar1;
        } while (uVar1 < local_d80.ring.items[lVar42].edge_valence);
      }
      lVar42 = lVar42 + 1;
      pDVar47 = (DynamicStackArray<float,_16UL,_64UL> *)((long)(pDVar47 + 6) + 0x40);
      pDVar46 = (DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)((long)local_e20 + 0x340);
    } while (lVar42 != 4);
    local_e38.field_0.x = *local_df0;
    local_e38.field_0.y = *local_de0;
    local_db0.P = local_e00->P;
    local_db0.dPdu = local_e00->dPdu;
    local_db0.dPdv = local_e00->dPdv;
    local_db0.ddPdudu = local_e00->ddPdudu;
    local_db0.ddPdvdv = local_e00->ddPdvdv;
    local_db0.ddPdudv = local_e00->ddPdudv;
    local_e10 = depth;
    FeatureAdaptiveEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::eval
              (&local_db0,&local_d80,(Vec2f *)&local_e38.field_0,dscale,depth,(BezierCurve *)0x0,
               (BezierCurve *)0x0,(BezierCurve *)0x0,(BezierCurve *)0x0);
    lVar42 = -0xd00;
    pDVar47 = &local_d80.ring.items[3].crease_weight;
    do {
      pvVar44 = *(vfloat_impl<4> **)((vfloat_impl<4> *)(pDVar47 + 5) + 4);
      if (pvVar44 != (vfloat_impl<4> *)0x0 &&
          (DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)((long)(pDVar47 + 1) + 0x40) !=
          (DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar44) {
        alignedFree(pvVar44);
      }
      pfVar43 = pDVar47->data;
      if (pfVar43 != (float *)0x0 && pDVar47 != (DynamicStackArray<float,_16UL,_64UL> *)pfVar43) {
        operator_delete__(pfVar43);
      }
      pDVar47 = (DynamicStackArray<float,_16UL,_64UL> *)((long)(pDVar47 + -7) + 0x40);
      lVar42 = lVar42 + 0x340;
    } while (lVar42 != 0);
LAB_00d41419:
    bVar52 = true;
  }
  return bVar52;
}

Assistant:

bool eval(Ref This, const float& u, const float& v, const float dscale, const size_t depth) 
        {
          if (!This) return false;
          //PRINT(depth);
          //PRINT2(u,v);
          
          switch (This.type()) 
          {
          case Patch::BILINEAR_PATCH: {
            //PRINT("bilinear");
            ((typename Patch::BilinearPatch*)This.object())->patch.eval(u,v,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale); 
            PATCH_DEBUG_SUBDIVISION(This,-1,c,c);
            return true;
          }
          case Patch::BSPLINE_PATCH: {
            //PRINT("bspline");
            ((typename Patch::BSplinePatch*)This.object())->patch.eval(u,v,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale);
            PATCH_DEBUG_SUBDIVISION(This,-1,c,-1);
            return true;
          }
          case Patch::BEZIER_PATCH: {
            //PRINT("bezier");
            ((typename Patch::BezierPatch*)This.object())->patch.eval(u,v,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale);
            PATCH_DEBUG_SUBDIVISION(This,-1,c,-1);
            return true;
          }
          case Patch::GREGORY_PATCH: {
            //PRINT("gregory");
            ((typename Patch::GregoryPatch*)This.object())->patch.eval(u,v,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale); 
            PATCH_DEBUG_SUBDIVISION(This,-1,-1,c);
            return true;
          }
          case Patch::SUBDIVIDED_QUAD_PATCH: {
            //PRINT("subdivided quad");
            return eval_quad(((typename Patch::SubdividedQuadPatch*)This.object()),u,v,dscale,depth);
          }
          case Patch::SUBDIVIDED_GENERAL_PATCH: { 
            //PRINT("general_patch");
            assert(dscale == 1.0f); 
            return eval_general(((typename Patch::SubdividedGeneralPatch*)This.object()),u,v,depth); 
          }
          case Patch::EVAL_PATCH: { 
            //PRINT("eval_patch");
            CatmullClarkPatch patch; patch.deserialize(This.object());
            FeatureAdaptiveEval<Vertex,Vertex_t>(patch,u,v,dscale,depth,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv);
            return true;
          }
          default: 
            assert(false); 
            return false;
          }
        }